

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_n<embree::sse2::OrientedCurve1Intersector1<embree::BezierCurveT,3,4>,embree::sse2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  undefined4 uVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  long lVar23;
  RTCFilterFunctionN p_Var24;
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined3 uVar31;
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined6 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  byte bVar56;
  ulong uVar57;
  ulong uVar58;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar59;
  long lVar60;
  ulong uVar61;
  long lVar62;
  ulong uVar63;
  bool bVar64;
  uint uVar65;
  int iVar66;
  uint uVar67;
  int iVar68;
  uint uVar69;
  uint uVar70;
  short sVar71;
  undefined2 uVar109;
  float fVar72;
  float fVar110;
  float fVar111;
  vfloat_impl<4> p00;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  float fVar112;
  float fVar136;
  float fVar137;
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar138;
  float fVar150;
  float fVar151;
  vfloat4 v;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar152;
  undefined8 uVar153;
  float fVar162;
  vfloat4 v_1;
  float fVar161;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar163;
  float fVar174;
  float fVar175;
  vfloat4 a;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar176;
  float fVar202;
  float fVar203;
  undefined1 auVar177 [16];
  undefined1 auVar180 [16];
  undefined1 auVar183 [16];
  undefined1 auVar186 [16];
  undefined1 auVar189 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  float fVar204;
  float fVar207;
  float fVar208;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar209;
  float fVar222;
  float fVar223;
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar214 [16];
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar228;
  float fVar229;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar258;
  float fVar261;
  undefined1 auVar247 [16];
  undefined1 auVar250 [16];
  float fVar259;
  float fVar260;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar278;
  float fVar281;
  vfloat4 a_1;
  undefined1 auVar269 [16];
  undefined1 auVar272 [16];
  float fVar279;
  float fVar280;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar289;
  float fVar290;
  float fVar300;
  float fVar302;
  vfloat4 a_2;
  float fVar304;
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar295 [16];
  float fVar301;
  float fVar303;
  float fVar305;
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar306;
  float fVar307;
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar312 [16];
  float fVar317;
  float fVar319;
  float fVar321;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar322;
  float fVar323;
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  vfloat_impl<4> p00_1;
  vfloat_impl<4> p01;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_418 [8];
  float fStack_410;
  float fStack_40c;
  undefined8 local_3e8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_3dc;
  float fStack_3cc;
  undefined8 local_3c8;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  float fStack_350;
  float fStack_34c;
  ulong local_340;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  Primitive *local_2a0;
  RTCFilterFunctionNArguments local_298;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [16];
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [16];
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  undefined8 local_218;
  float fStack_210;
  float fStack_20c;
  float afStack_208 [4];
  undefined8 local_1f8;
  float local_1f0;
  float local_1ec;
  float fStack_1e8;
  uint local_1e4;
  float local_1e0;
  uint local_1dc;
  uint local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  float afStack_58 [10];
  undefined1 auVar106 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 uVar108;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  
  PVar17 = prim[1];
  uVar57 = (ulong)(byte)PVar17;
  lVar62 = uVar57 * 0x25;
  pPVar8 = prim + lVar62 + 6;
  fVar151 = *(float *)(pPVar8 + 0xc);
  fVar152 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar8) * fVar151;
  fVar161 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar151;
  fVar162 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar151;
  fVar138 = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar150 = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar151 = fVar151 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar18 = *(undefined4 *)(prim + uVar57 * 4 + 6);
  uVar108 = (undefined1)((uint)uVar18 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar18 >> 0x10);
  uVar153 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar18));
  uVar108 = (undefined1)((uint)uVar18 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar153 >> 0x20),uVar108),uVar108);
  sVar71 = CONCAT11((char)uVar18,(char)uVar18);
  uVar58 = CONCAT62(uVar34,sVar71);
  auVar126._8_4_ = 0;
  auVar126._0_8_ = uVar58;
  auVar126._12_2_ = uVar109;
  auVar126._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar153 >> 0x20);
  auVar140._12_4_ = auVar126._12_4_;
  auVar140._8_2_ = 0;
  auVar140._0_8_ = uVar58;
  auVar140._10_2_ = uVar109;
  auVar73._10_6_ = auVar140._10_6_;
  auVar73._8_2_ = uVar109;
  auVar73._0_8_ = uVar58;
  uVar109 = (undefined2)uVar34;
  auVar35._4_8_ = auVar73._8_8_;
  auVar35._2_2_ = uVar109;
  auVar35._0_2_ = uVar109;
  fVar322 = (float)((int)sVar71 >> 8);
  fVar327 = (float)(auVar35._0_4_ >> 0x18);
  fVar328 = (float)(auVar73._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar57 * 5 + 6);
  uVar108 = (undefined1)((uint)uVar18 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar18 >> 0x10);
  uVar153 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar18));
  uVar108 = (undefined1)((uint)uVar18 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar153 >> 0x20),uVar108),uVar108);
  sVar71 = CONCAT11((char)uVar18,(char)uVar18);
  uVar58 = CONCAT62(uVar34,sVar71);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar58;
  auVar115._12_2_ = uVar109;
  auVar115._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar153 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar58;
  auVar114._10_2_ = uVar109;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar109;
  auVar113._0_8_ = uVar58;
  uVar109 = (undefined2)uVar34;
  auVar36._4_8_ = auVar113._8_8_;
  auVar36._2_2_ = uVar109;
  auVar36._0_2_ = uVar109;
  fVar163 = (float)((int)sVar71 >> 8);
  fVar174 = (float)(auVar36._0_4_ >> 0x18);
  fVar175 = (float)(auVar113._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar57 * 6 + 6);
  uVar108 = (undefined1)((uint)uVar18 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar18 >> 0x10);
  uVar153 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar18));
  uVar108 = (undefined1)((uint)uVar18 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar153 >> 0x20),uVar108),uVar108);
  sVar71 = CONCAT11((char)uVar18,(char)uVar18);
  uVar58 = CONCAT62(uVar34,sVar71);
  auVar118._8_4_ = 0;
  auVar118._0_8_ = uVar58;
  auVar118._12_2_ = uVar109;
  auVar118._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar153 >> 0x20);
  auVar117._12_4_ = auVar118._12_4_;
  auVar117._8_2_ = 0;
  auVar117._0_8_ = uVar58;
  auVar117._10_2_ = uVar109;
  auVar116._10_6_ = auVar117._10_6_;
  auVar116._8_2_ = uVar109;
  auVar116._0_8_ = uVar58;
  uVar109 = (undefined2)uVar34;
  auVar37._4_8_ = auVar116._8_8_;
  auVar37._2_2_ = uVar109;
  auVar37._0_2_ = uVar109;
  fVar204 = (float)((int)sVar71 >> 8);
  fVar207 = (float)(auVar37._0_4_ >> 0x18);
  fVar208 = (float)(auVar116._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar57 * 0xf + 6);
  uVar108 = (undefined1)((uint)uVar18 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar18 >> 0x10);
  uVar153 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar18));
  uVar108 = (undefined1)((uint)uVar18 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar153 >> 0x20),uVar108),uVar108);
  sVar71 = CONCAT11((char)uVar18,(char)uVar18);
  uVar58 = CONCAT62(uVar34,sVar71);
  auVar121._8_4_ = 0;
  auVar121._0_8_ = uVar58;
  auVar121._12_2_ = uVar109;
  auVar121._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar153 >> 0x20);
  auVar120._12_4_ = auVar121._12_4_;
  auVar120._8_2_ = 0;
  auVar120._0_8_ = uVar58;
  auVar120._10_2_ = uVar109;
  auVar119._10_6_ = auVar120._10_6_;
  auVar119._8_2_ = uVar109;
  auVar119._0_8_ = uVar58;
  uVar109 = (undefined2)uVar34;
  auVar38._4_8_ = auVar119._8_8_;
  auVar38._2_2_ = uVar109;
  auVar38._0_2_ = uVar109;
  fVar72 = (float)((int)sVar71 >> 8);
  fVar110 = (float)(auVar38._0_4_ >> 0x18);
  fVar111 = (float)(auVar119._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar108 = (undefined1)((uint)uVar18 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar18 >> 0x10);
  uVar153 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar18));
  uVar108 = (undefined1)((uint)uVar18 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar153 >> 0x20),uVar108),uVar108);
  sVar71 = CONCAT11((char)uVar18,(char)uVar18);
  uVar58 = CONCAT62(uVar34,sVar71);
  auVar179._8_4_ = 0;
  auVar179._0_8_ = uVar58;
  auVar179._12_2_ = uVar109;
  auVar179._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar153 >> 0x20);
  auVar178._12_4_ = auVar179._12_4_;
  auVar178._8_2_ = 0;
  auVar178._0_8_ = uVar58;
  auVar178._10_2_ = uVar109;
  auVar177._10_6_ = auVar178._10_6_;
  auVar177._8_2_ = uVar109;
  auVar177._0_8_ = uVar58;
  uVar109 = (undefined2)uVar34;
  auVar39._4_8_ = auVar177._8_8_;
  auVar39._2_2_ = uVar109;
  auVar39._0_2_ = uVar109;
  fVar209 = (float)((int)sVar71 >> 8);
  fVar222 = (float)(auVar39._0_4_ >> 0x18);
  fVar223 = (float)(auVar177._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + uVar57 + 6);
  uVar108 = (undefined1)((uint)uVar18 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar18 >> 0x10);
  uVar153 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar18));
  uVar108 = (undefined1)((uint)uVar18 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar153 >> 0x20),uVar108),uVar108);
  sVar71 = CONCAT11((char)uVar18,(char)uVar18);
  uVar58 = CONCAT62(uVar34,sVar71);
  auVar182._8_4_ = 0;
  auVar182._0_8_ = uVar58;
  auVar182._12_2_ = uVar109;
  auVar182._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar153 >> 0x20);
  auVar181._12_4_ = auVar182._12_4_;
  auVar181._8_2_ = 0;
  auVar181._0_8_ = uVar58;
  auVar181._10_2_ = uVar109;
  auVar180._10_6_ = auVar181._10_6_;
  auVar180._8_2_ = uVar109;
  auVar180._0_8_ = uVar58;
  uVar109 = (undefined2)uVar34;
  auVar40._4_8_ = auVar180._8_8_;
  auVar40._2_2_ = uVar109;
  auVar40._0_2_ = uVar109;
  fVar244 = (float)((int)sVar71 >> 8);
  fVar258 = (float)(auVar40._0_4_ >> 0x18);
  fVar261 = (float)(auVar180._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar57 * 0x1a + 6);
  uVar108 = (undefined1)((uint)uVar18 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar18 >> 0x10);
  uVar153 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar18));
  uVar108 = (undefined1)((uint)uVar18 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar153 >> 0x20),uVar108),uVar108);
  sVar71 = CONCAT11((char)uVar18,(char)uVar18);
  uVar58 = CONCAT62(uVar34,sVar71);
  auVar185._8_4_ = 0;
  auVar185._0_8_ = uVar58;
  auVar185._12_2_ = uVar109;
  auVar185._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar153 >> 0x20);
  auVar184._12_4_ = auVar185._12_4_;
  auVar184._8_2_ = 0;
  auVar184._0_8_ = uVar58;
  auVar184._10_2_ = uVar109;
  auVar183._10_6_ = auVar184._10_6_;
  auVar183._8_2_ = uVar109;
  auVar183._0_8_ = uVar58;
  uVar109 = (undefined2)uVar34;
  auVar41._4_8_ = auVar183._8_8_;
  auVar41._2_2_ = uVar109;
  auVar41._0_2_ = uVar109;
  fVar228 = (float)((int)sVar71 >> 8);
  fVar239 = (float)(auVar41._0_4_ >> 0x18);
  fVar241 = (float)(auVar183._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar57 * 0x1b + 6);
  uVar108 = (undefined1)((uint)uVar18 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar18 >> 0x10);
  uVar153 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar18));
  uVar108 = (undefined1)((uint)uVar18 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar153 >> 0x20),uVar108),uVar108);
  sVar71 = CONCAT11((char)uVar18,(char)uVar18);
  uVar58 = CONCAT62(uVar34,sVar71);
  auVar188._8_4_ = 0;
  auVar188._0_8_ = uVar58;
  auVar188._12_2_ = uVar109;
  auVar188._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar153 >> 0x20);
  auVar187._12_4_ = auVar188._12_4_;
  auVar187._8_2_ = 0;
  auVar187._0_8_ = uVar58;
  auVar187._10_2_ = uVar109;
  auVar186._10_6_ = auVar187._10_6_;
  auVar186._8_2_ = uVar109;
  auVar186._0_8_ = uVar58;
  uVar109 = (undefined2)uVar34;
  auVar42._4_8_ = auVar186._8_8_;
  auVar42._2_2_ = uVar109;
  auVar42._0_2_ = uVar109;
  fVar266 = (float)((int)sVar71 >> 8);
  fVar278 = (float)(auVar42._0_4_ >> 0x18);
  fVar281 = (float)(auVar186._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar57 * 0x1c + 6);
  uVar108 = (undefined1)((uint)uVar18 >> 0x18);
  uVar109 = CONCAT11(uVar108,uVar108);
  uVar108 = (undefined1)((uint)uVar18 >> 0x10);
  uVar153 = CONCAT35(CONCAT21(uVar109,uVar108),CONCAT14(uVar108,uVar18));
  uVar108 = (undefined1)((uint)uVar18 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar153 >> 0x20),uVar108),uVar108);
  sVar71 = CONCAT11((char)uVar18,(char)uVar18);
  uVar58 = CONCAT62(uVar34,sVar71);
  auVar191._8_4_ = 0;
  auVar191._0_8_ = uVar58;
  auVar191._12_2_ = uVar109;
  auVar191._14_2_ = uVar109;
  uVar109 = (undefined2)((ulong)uVar153 >> 0x20);
  auVar190._12_4_ = auVar191._12_4_;
  auVar190._8_2_ = 0;
  auVar190._0_8_ = uVar58;
  auVar190._10_2_ = uVar109;
  auVar189._10_6_ = auVar190._10_6_;
  auVar189._8_2_ = uVar109;
  auVar189._0_8_ = uVar58;
  uVar109 = (undefined2)uVar34;
  auVar43._4_8_ = auVar189._8_8_;
  auVar43._2_2_ = uVar109;
  auVar43._0_2_ = uVar109;
  fVar112 = (float)((int)sVar71 >> 8);
  fVar136 = (float)(auVar43._0_4_ >> 0x18);
  fVar137 = (float)(auVar189._8_4_ >> 0x18);
  fVar306 = fVar138 * fVar322 + fVar150 * fVar163 + fVar151 * fVar204;
  fVar316 = fVar138 * fVar327 + fVar150 * fVar174 + fVar151 * fVar207;
  fVar318 = fVar138 * fVar328 + fVar150 * fVar175 + fVar151 * fVar208;
  fVar320 = fVar138 * (float)(auVar140._12_4_ >> 0x18) +
            fVar150 * (float)(auVar114._12_4_ >> 0x18) + fVar151 * (float)(auVar117._12_4_ >> 0x18);
  fVar289 = fVar138 * fVar72 + fVar150 * fVar209 + fVar151 * fVar244;
  fVar300 = fVar138 * fVar110 + fVar150 * fVar222 + fVar151 * fVar258;
  fVar302 = fVar138 * fVar111 + fVar150 * fVar223 + fVar151 * fVar261;
  fVar304 = fVar138 * (float)(auVar120._12_4_ >> 0x18) +
            fVar150 * (float)(auVar178._12_4_ >> 0x18) + fVar151 * (float)(auVar181._12_4_ >> 0x18);
  fVar176 = fVar138 * fVar228 + fVar150 * fVar266 + fVar151 * fVar112;
  fVar202 = fVar138 * fVar239 + fVar150 * fVar278 + fVar151 * fVar136;
  fVar203 = fVar138 * fVar241 + fVar150 * fVar281 + fVar151 * fVar137;
  fVar138 = fVar138 * (float)(auVar184._12_4_ >> 0x18) +
            fVar150 * (float)(auVar187._12_4_ >> 0x18) + fVar151 * (float)(auVar190._12_4_ >> 0x18);
  fVar323 = fVar322 * fVar152 + fVar163 * fVar161 + fVar204 * fVar162;
  fVar327 = fVar327 * fVar152 + fVar174 * fVar161 + fVar207 * fVar162;
  fVar328 = fVar328 * fVar152 + fVar175 * fVar161 + fVar208 * fVar162;
  fVar329 = (float)(auVar140._12_4_ >> 0x18) * fVar152 +
            (float)(auVar114._12_4_ >> 0x18) * fVar161 + (float)(auVar117._12_4_ >> 0x18) * fVar162;
  fVar244 = fVar72 * fVar152 + fVar209 * fVar161 + fVar244 * fVar162;
  fVar258 = fVar110 * fVar152 + fVar222 * fVar161 + fVar258 * fVar162;
  fVar261 = fVar111 * fVar152 + fVar223 * fVar161 + fVar261 * fVar162;
  fVar322 = (float)(auVar120._12_4_ >> 0x18) * fVar152 +
            (float)(auVar178._12_4_ >> 0x18) * fVar161 + (float)(auVar181._12_4_ >> 0x18) * fVar162;
  fVar228 = fVar152 * fVar228 + fVar161 * fVar266 + fVar162 * fVar112;
  fVar239 = fVar152 * fVar239 + fVar161 * fVar278 + fVar162 * fVar136;
  fVar241 = fVar152 * fVar241 + fVar161 * fVar281 + fVar162 * fVar137;
  fVar266 = fVar152 * (float)(auVar184._12_4_ >> 0x18) +
            fVar161 * (float)(auVar187._12_4_ >> 0x18) + fVar162 * (float)(auVar190._12_4_ >> 0x18);
  fVar151 = (float)DAT_01f80d30;
  fVar72 = DAT_01f80d30._4_4_;
  fVar110 = DAT_01f80d30._8_4_;
  fVar111 = DAT_01f80d30._12_4_;
  uVar65 = -(uint)(fVar151 <= ABS(fVar306));
  uVar67 = -(uint)(fVar72 <= ABS(fVar316));
  uVar69 = -(uint)(fVar110 <= ABS(fVar318));
  uVar70 = -(uint)(fVar111 <= ABS(fVar320));
  auVar308._0_4_ = (uint)fVar306 & uVar65;
  auVar308._4_4_ = (uint)fVar316 & uVar67;
  auVar308._8_4_ = (uint)fVar318 & uVar69;
  auVar308._12_4_ = (uint)fVar320 & uVar70;
  auVar154._0_4_ = ~uVar65 & (uint)fVar151;
  auVar154._4_4_ = ~uVar67 & (uint)fVar72;
  auVar154._8_4_ = ~uVar69 & (uint)fVar110;
  auVar154._12_4_ = ~uVar70 & (uint)fVar111;
  auVar154 = auVar154 | auVar308;
  uVar65 = -(uint)(fVar151 <= ABS(fVar289));
  uVar67 = -(uint)(fVar72 <= ABS(fVar300));
  uVar69 = -(uint)(fVar110 <= ABS(fVar302));
  uVar70 = -(uint)(fVar111 <= ABS(fVar304));
  auVar291._0_4_ = (uint)fVar289 & uVar65;
  auVar291._4_4_ = (uint)fVar300 & uVar67;
  auVar291._8_4_ = (uint)fVar302 & uVar69;
  auVar291._12_4_ = (uint)fVar304 & uVar70;
  auVar205._0_4_ = ~uVar65 & (uint)fVar151;
  auVar205._4_4_ = ~uVar67 & (uint)fVar72;
  auVar205._8_4_ = ~uVar69 & (uint)fVar110;
  auVar205._12_4_ = ~uVar70 & (uint)fVar111;
  auVar205 = auVar205 | auVar291;
  uVar65 = -(uint)(fVar151 <= ABS(fVar176));
  uVar67 = -(uint)(fVar72 <= ABS(fVar202));
  uVar69 = -(uint)(fVar110 <= ABS(fVar203));
  uVar70 = -(uint)(fVar111 <= ABS(fVar138));
  auVar192._0_4_ = (uint)fVar176 & uVar65;
  auVar192._4_4_ = (uint)fVar202 & uVar67;
  auVar192._8_4_ = (uint)fVar203 & uVar69;
  auVar192._12_4_ = (uint)fVar138 & uVar70;
  auVar210._0_4_ = ~uVar65 & (uint)fVar151;
  auVar210._4_4_ = ~uVar67 & (uint)fVar72;
  auVar210._8_4_ = ~uVar69 & (uint)fVar110;
  auVar210._12_4_ = ~uVar70 & (uint)fVar111;
  auVar210 = auVar210 | auVar192;
  auVar73 = rcpps(_DAT_01f80d30,auVar154);
  fVar151 = auVar73._0_4_;
  fVar111 = auVar73._4_4_;
  fVar163 = auVar73._8_4_;
  fVar209 = auVar73._12_4_;
  fVar151 = (1.0 - auVar154._0_4_ * fVar151) * fVar151 + fVar151;
  fVar111 = (1.0 - auVar154._4_4_ * fVar111) * fVar111 + fVar111;
  fVar163 = (1.0 - auVar154._8_4_ * fVar163) * fVar163 + fVar163;
  fVar209 = (1.0 - auVar154._12_4_ * fVar209) * fVar209 + fVar209;
  auVar73 = rcpps(auVar73,auVar205);
  fVar72 = auVar73._0_4_;
  fVar112 = auVar73._4_4_;
  fVar174 = auVar73._8_4_;
  fVar222 = auVar73._12_4_;
  fVar72 = (1.0 - auVar205._0_4_ * fVar72) * fVar72 + fVar72;
  fVar112 = (1.0 - auVar205._4_4_ * fVar112) * fVar112 + fVar112;
  fVar174 = (1.0 - auVar205._8_4_ * fVar174) * fVar174 + fVar174;
  fVar222 = (1.0 - auVar205._12_4_ * fVar222) * fVar222 + fVar222;
  auVar73 = rcpps(auVar73,auVar210);
  fVar110 = auVar73._0_4_;
  fVar136 = auVar73._4_4_;
  fVar175 = auVar73._8_4_;
  fVar223 = auVar73._12_4_;
  fVar110 = (1.0 - auVar210._0_4_ * fVar110) * fVar110 + fVar110;
  fVar136 = (1.0 - auVar210._4_4_ * fVar136) * fVar136 + fVar136;
  fVar175 = (1.0 - auVar210._8_4_ * fVar175) * fVar175 + fVar175;
  fVar223 = (1.0 - auVar210._12_4_ * fVar223) * fVar223 + fVar223;
  fVar278 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar62 + 0x16)) *
            *(float *)(prim + lVar62 + 0x1a);
  uVar58 = *(ulong *)(prim + uVar57 * 7 + 6);
  uVar109 = (undefined2)(uVar58 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar58;
  auVar74._12_2_ = uVar109;
  auVar74._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar58 >> 0x20);
  auVar252._12_4_ = auVar74._12_4_;
  auVar252._8_2_ = 0;
  auVar252._0_8_ = uVar58;
  auVar252._10_2_ = uVar109;
  auVar142._10_6_ = auVar252._10_6_;
  auVar142._8_2_ = uVar109;
  auVar142._0_8_ = uVar58;
  uVar109 = (undefined2)(uVar58 >> 0x10);
  auVar44._4_8_ = auVar142._8_8_;
  auVar44._2_2_ = uVar109;
  auVar44._0_2_ = uVar109;
  fVar137 = (float)(auVar44._0_4_ >> 0x10);
  fVar176 = (float)(auVar142._8_4_ >> 0x10);
  uVar63 = *(ulong *)(prim + uVar57 * 0xb + 6);
  uVar109 = (undefined2)(uVar63 >> 0x30);
  auVar157._8_4_ = 0;
  auVar157._0_8_ = uVar63;
  auVar157._12_2_ = uVar109;
  auVar157._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar63 >> 0x20);
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._8_2_ = 0;
  auVar156._0_8_ = uVar63;
  auVar156._10_2_ = uVar109;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._8_2_ = uVar109;
  auVar155._0_8_ = uVar63;
  uVar109 = (undefined2)(uVar63 >> 0x10);
  auVar45._4_8_ = auVar155._8_8_;
  auVar45._2_2_ = uVar109;
  auVar45._0_2_ = uVar109;
  uVar9 = *(ulong *)(prim + uVar57 * 9 + 6);
  uVar109 = (undefined2)(uVar9 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar9;
  auVar77._12_2_ = uVar109;
  auVar77._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar9 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar9;
  auVar76._10_2_ = uVar109;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar109;
  auVar75._0_8_ = uVar9;
  uVar109 = (undefined2)(uVar9 >> 0x10);
  auVar46._4_8_ = auVar75._8_8_;
  auVar46._2_2_ = uVar109;
  auVar46._0_2_ = uVar109;
  fVar138 = (float)(auVar46._0_4_ >> 0x10);
  fVar202 = (float)(auVar75._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar57 * 0xd + 6);
  uVar109 = (undefined2)(uVar10 >> 0x30);
  auVar213._8_4_ = 0;
  auVar213._0_8_ = uVar10;
  auVar213._12_2_ = uVar109;
  auVar213._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar10 >> 0x20);
  auVar212._12_4_ = auVar213._12_4_;
  auVar212._8_2_ = 0;
  auVar212._0_8_ = uVar10;
  auVar212._10_2_ = uVar109;
  auVar211._10_6_ = auVar212._10_6_;
  auVar211._8_2_ = uVar109;
  auVar211._0_8_ = uVar10;
  uVar109 = (undefined2)(uVar10 >> 0x10);
  auVar47._4_8_ = auVar211._8_8_;
  auVar47._2_2_ = uVar109;
  auVar47._0_2_ = uVar109;
  uVar11 = *(ulong *)(prim + uVar57 * 0x12 + 6);
  uVar109 = (undefined2)(uVar11 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar11;
  auVar80._12_2_ = uVar109;
  auVar80._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar11 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar11;
  auVar79._10_2_ = uVar109;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar109;
  auVar78._0_8_ = uVar11;
  uVar109 = (undefined2)(uVar11 >> 0x10);
  auVar48._4_8_ = auVar78._8_8_;
  auVar48._2_2_ = uVar109;
  auVar48._0_2_ = uVar109;
  fVar150 = (float)(auVar48._0_4_ >> 0x10);
  fVar203 = (float)(auVar78._8_4_ >> 0x10);
  uVar61 = (ulong)(uint)((int)(uVar57 * 5) << 2);
  uVar12 = *(ulong *)(prim + uVar57 * 2 + uVar61 + 6);
  uVar109 = (undefined2)(uVar12 >> 0x30);
  auVar249._8_4_ = 0;
  auVar249._0_8_ = uVar12;
  auVar249._12_2_ = uVar109;
  auVar249._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar12 >> 0x20);
  auVar248._12_4_ = auVar249._12_4_;
  auVar248._8_2_ = 0;
  auVar248._0_8_ = uVar12;
  auVar248._10_2_ = uVar109;
  auVar247._10_6_ = auVar248._10_6_;
  auVar247._8_2_ = uVar109;
  auVar247._0_8_ = uVar12;
  uVar109 = (undefined2)(uVar12 >> 0x10);
  auVar49._4_8_ = auVar247._8_8_;
  auVar49._2_2_ = uVar109;
  auVar49._0_2_ = uVar109;
  uVar61 = *(ulong *)(prim + uVar61 + 6);
  uVar109 = (undefined2)(uVar61 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar61;
  auVar83._12_2_ = uVar109;
  auVar83._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar61 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar61;
  auVar82._10_2_ = uVar109;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar109;
  auVar81._0_8_ = uVar61;
  uVar109 = (undefined2)(uVar61 >> 0x10);
  auVar50._4_8_ = auVar81._8_8_;
  auVar50._2_2_ = uVar109;
  auVar50._0_2_ = uVar109;
  fVar152 = (float)(auVar50._0_4_ >> 0x10);
  fVar204 = (float)(auVar81._8_4_ >> 0x10);
  uVar13 = *(ulong *)(prim + uVar57 * 0x18 + 6);
  uVar109 = (undefined2)(uVar13 >> 0x30);
  auVar271._8_4_ = 0;
  auVar271._0_8_ = uVar13;
  auVar271._12_2_ = uVar109;
  auVar271._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar13 >> 0x20);
  auVar270._12_4_ = auVar271._12_4_;
  auVar270._8_2_ = 0;
  auVar270._0_8_ = uVar13;
  auVar270._10_2_ = uVar109;
  auVar269._10_6_ = auVar270._10_6_;
  auVar269._8_2_ = uVar109;
  auVar269._0_8_ = uVar13;
  uVar109 = (undefined2)(uVar13 >> 0x10);
  auVar51._4_8_ = auVar269._8_8_;
  auVar51._2_2_ = uVar109;
  auVar51._0_2_ = uVar109;
  uVar14 = *(ulong *)(prim + uVar57 * 0x1d + 6);
  uVar109 = (undefined2)(uVar14 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar14;
  auVar86._12_2_ = uVar109;
  auVar86._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar14 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar14;
  auVar85._10_2_ = uVar109;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar109;
  auVar84._0_8_ = uVar14;
  uVar109 = (undefined2)(uVar14 >> 0x10);
  auVar52._4_8_ = auVar84._8_8_;
  auVar52._2_2_ = uVar109;
  auVar52._0_2_ = uVar109;
  fVar161 = (float)(auVar52._0_4_ >> 0x10);
  fVar207 = (float)(auVar84._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar57 + (ulong)(byte)PVar17 * 0x20 + 6);
  uVar109 = (undefined2)(uVar15 >> 0x30);
  auVar294._8_4_ = 0;
  auVar294._0_8_ = uVar15;
  auVar294._12_2_ = uVar109;
  auVar294._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar15 >> 0x20);
  auVar293._12_4_ = auVar294._12_4_;
  auVar293._8_2_ = 0;
  auVar293._0_8_ = uVar15;
  auVar293._10_2_ = uVar109;
  auVar292._10_6_ = auVar293._10_6_;
  auVar292._8_2_ = uVar109;
  auVar292._0_8_ = uVar15;
  uVar109 = (undefined2)(uVar15 >> 0x10);
  auVar53._4_8_ = auVar292._8_8_;
  auVar53._2_2_ = uVar109;
  auVar53._0_2_ = uVar109;
  uVar16 = *(ulong *)(prim + ((ulong)(byte)PVar17 * 0x20 - uVar57) + 6);
  uVar109 = (undefined2)(uVar16 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar16;
  auVar89._12_2_ = uVar109;
  auVar89._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar16 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar16;
  auVar88._10_2_ = uVar109;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar109;
  auVar87._0_8_ = uVar16;
  uVar109 = (undefined2)(uVar16 >> 0x10);
  auVar54._4_8_ = auVar87._8_8_;
  auVar54._2_2_ = uVar109;
  auVar54._0_2_ = uVar109;
  fVar162 = (float)(auVar54._0_4_ >> 0x10);
  fVar208 = (float)(auVar87._8_4_ >> 0x10);
  uVar57 = *(ulong *)(prim + uVar57 * 0x23 + 6);
  uVar109 = (undefined2)(uVar57 >> 0x30);
  auVar311._8_4_ = 0;
  auVar311._0_8_ = uVar57;
  auVar311._12_2_ = uVar109;
  auVar311._14_2_ = uVar109;
  uVar109 = (undefined2)(uVar57 >> 0x20);
  auVar310._12_4_ = auVar311._12_4_;
  auVar310._8_2_ = 0;
  auVar310._0_8_ = uVar57;
  auVar310._10_2_ = uVar109;
  auVar309._10_6_ = auVar310._10_6_;
  auVar309._8_2_ = uVar109;
  auVar309._0_8_ = uVar57;
  uVar109 = (undefined2)(uVar57 >> 0x10);
  auVar55._4_8_ = auVar309._8_8_;
  auVar55._2_2_ = uVar109;
  auVar55._0_2_ = uVar109;
  auVar158._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar137) * fVar278 + fVar137) - fVar327) *
                fVar111,((((float)(int)(short)uVar63 - (float)(int)(short)uVar58) * fVar278 +
                         (float)(int)(short)uVar58) - fVar323) * fVar151);
  auVar158._8_4_ =
       ((((float)(auVar155._8_4_ >> 0x10) - fVar176) * fVar278 + fVar176) - fVar328) * fVar163;
  auVar158._12_4_ =
       ((((float)(auVar156._12_4_ >> 0x10) - (float)(auVar252._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar252._12_4_ >> 0x10)) - fVar329) * fVar209;
  auVar214._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar9) * fVar278 + (float)(int)(short)uVar9
        ) - fVar323) * fVar151;
  auVar214._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar138) * fVar278 + fVar138) - fVar327) * fVar111;
  auVar214._8_4_ =
       ((((float)(auVar211._8_4_ >> 0x10) - fVar202) * fVar278 + fVar202) - fVar328) * fVar163;
  auVar214._12_4_ =
       ((((float)(auVar212._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar329) * fVar209;
  auVar250._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar150) * fVar278 + fVar150) - fVar258) *
                fVar112,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar278 +
                         (float)(int)(short)uVar11) - fVar244) * fVar72);
  auVar250._8_4_ =
       ((((float)(auVar247._8_4_ >> 0x10) - fVar203) * fVar278 + fVar203) - fVar261) * fVar174;
  auVar250._12_4_ =
       ((((float)(auVar248._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar322) * fVar222;
  auVar272._0_4_ =
       ((((float)(int)(short)uVar13 - (float)(int)(short)uVar61) * fVar278 +
        (float)(int)(short)uVar61) - fVar244) * fVar72;
  auVar272._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar152) * fVar278 + fVar152) - fVar258) * fVar112;
  auVar272._8_4_ =
       ((((float)(auVar269._8_4_ >> 0x10) - fVar204) * fVar278 + fVar204) - fVar261) * fVar174;
  auVar272._12_4_ =
       ((((float)(auVar270._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar322) * fVar222;
  auVar295._0_8_ =
       CONCAT44(((((float)(auVar53._0_4_ >> 0x10) - fVar161) * fVar278 + fVar161) - fVar239) *
                fVar136,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar278 +
                         (float)(int)(short)uVar14) - fVar228) * fVar110);
  auVar295._8_4_ =
       ((((float)(auVar292._8_4_ >> 0x10) - fVar207) * fVar278 + fVar207) - fVar241) * fVar175;
  auVar295._12_4_ =
       ((((float)(auVar293._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar266) * fVar223;
  auVar312._0_4_ =
       ((((float)(int)(short)uVar57 - (float)(int)(short)uVar16) * fVar278 +
        (float)(int)(short)uVar16) - fVar228) * fVar110;
  auVar312._4_4_ =
       ((((float)(auVar55._0_4_ >> 0x10) - fVar162) * fVar278 + fVar162) - fVar239) * fVar136;
  auVar312._8_4_ =
       ((((float)(auVar309._8_4_ >> 0x10) - fVar208) * fVar278 + fVar208) - fVar241) * fVar175;
  auVar312._12_4_ =
       ((((float)(auVar310._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar278 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar266) * fVar223;
  auVar139._8_4_ = auVar158._8_4_;
  auVar139._0_8_ = auVar158._0_8_;
  auVar139._12_4_ = auVar158._12_4_;
  auVar140 = minps(auVar139,auVar214);
  auVar90._8_4_ = auVar250._8_4_;
  auVar90._0_8_ = auVar250._0_8_;
  auVar90._12_4_ = auVar250._12_4_;
  auVar73 = minps(auVar90,auVar272);
  auVar140 = maxps(auVar140,auVar73);
  auVar91._8_4_ = auVar295._8_4_;
  auVar91._0_8_ = auVar295._0_8_;
  auVar91._12_4_ = auVar295._12_4_;
  auVar73 = minps(auVar91,auVar312);
  uVar18 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar122._4_4_ = uVar18;
  auVar122._0_4_ = uVar18;
  auVar122._8_4_ = uVar18;
  auVar122._12_4_ = uVar18;
  auVar73 = maxps(auVar73,auVar122);
  auVar73 = maxps(auVar140,auVar73);
  local_1c8 = auVar73._0_4_ * 0.99999964;
  fStack_1c4 = auVar73._4_4_ * 0.99999964;
  fStack_1c0 = auVar73._8_4_ * 0.99999964;
  fStack_1bc = auVar73._12_4_ * 0.99999964;
  auVar73 = maxps(auVar158,auVar214);
  auVar140 = maxps(auVar250,auVar272);
  auVar73 = minps(auVar73,auVar140);
  auVar140 = maxps(auVar295,auVar312);
  fVar151 = (ray->super_RayK<1>).tfar;
  auVar92._4_4_ = fVar151;
  auVar92._0_4_ = fVar151;
  auVar92._8_4_ = fVar151;
  auVar92._12_4_ = fVar151;
  auVar140 = minps(auVar140,auVar92);
  auVar73 = minps(auVar73,auVar140);
  uVar65 = (uint)(byte)PVar17;
  auVar123._0_4_ = -(uint)(uVar65 != 0 && local_1c8 <= auVar73._0_4_ * 1.0000004);
  auVar123._4_4_ = -(uint)(1 < uVar65 && fStack_1c4 <= auVar73._4_4_ * 1.0000004);
  auVar123._8_4_ = -(uint)(2 < uVar65 && fStack_1c0 <= auVar73._8_4_ * 1.0000004);
  auVar123._12_4_ = -(uint)(3 < uVar65 && fStack_1bc <= auVar73._12_4_ * 1.0000004);
  uVar65 = movmskps(uVar65,auVar123);
  if (uVar65 == 0) {
    return;
  }
  uVar65 = uVar65 & 0xff;
  local_178._0_4_ = -(uint)((int)mm_lookupmask_ps._240_4_ < 0);
  local_178._4_4_ = -(uint)((int)mm_lookupmask_ps._244_4_ < 0);
  local_178._8_4_ = -(uint)((int)mm_lookupmask_ps._248_4_ < 0);
  local_178._12_4_ = 0;
  local_2a0 = prim;
LAB_00aecc1c:
  lVar62 = 0;
  if ((ulong)uVar65 != 0) {
    for (; (uVar65 >> lVar62 & 1) == 0; lVar62 = lVar62 + 1) {
    }
  }
  uVar67 = *(uint *)(local_2a0 + lVar62 * 4 + 6);
  pGVar19 = (context->scene->geometries).items[*(uint *)(local_2a0 + 2)].ptr;
  local_338._0_4_ = pGVar19->fnumTimeSegments;
  fVar151 = (pGVar19->time_range).lower;
  fVar72 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar151) /
           ((pGVar19->time_range).upper - fVar151)) * pGVar19->fnumTimeSegments;
  fVar151 = floorf(fVar72);
  if ((float)local_338._0_4_ + -1.0 <= fVar151) {
    fVar151 = (float)local_338._0_4_ + -1.0;
  }
  fVar110 = 0.0;
  if (0.0 <= fVar151) {
    fVar110 = fVar151;
  }
  fVar72 = fVar72 - fVar110;
  local_340 = (ulong)uVar67;
  uVar58 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                           (ulong)uVar67 *
                           pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar60 = (long)(int)fVar110 * 0x38;
  lVar21 = *(long *)(_Var20 + lVar60);
  lVar22 = *(long *)(_Var20 + 0x10 + lVar60);
  pfVar3 = (float *)(lVar21 + lVar22 * uVar58);
  fVar151 = *pfVar3;
  fVar110 = pfVar3[1];
  fVar111 = pfVar3[2];
  fVar112 = pfVar3[3];
  lVar62 = uVar58 + 1;
  pfVar3 = (float *)(lVar21 + lVar22 * lVar62);
  lVar1 = uVar58 + 2;
  pfVar4 = (float *)(lVar21 + lVar22 * lVar1);
  lVar2 = uVar58 + 3;
  pfVar5 = (float *)(lVar21 + lVar22 * lVar2);
  fVar136 = *pfVar5;
  fVar137 = pfVar5[1];
  fVar138 = pfVar5[2];
  fVar150 = pfVar5[3];
  lVar21 = *(long *)&pGVar19[4].fnumTimeSegments;
  lVar22 = *(long *)(lVar21 + lVar60);
  lVar23 = *(long *)(lVar21 + 0x10 + lVar60);
  pfVar5 = (float *)(lVar22 + lVar23 * uVar58);
  fVar152 = *pfVar5;
  fVar161 = pfVar5[1];
  fVar162 = pfVar5[2];
  fVar163 = pfVar5[3];
  pfVar5 = (float *)(lVar22 + lVar23 * lVar62);
  pfVar6 = (float *)(lVar22 + lVar23 * lVar1);
  pfVar7 = (float *)(lVar22 + lVar23 * lVar2);
  fVar174 = *pfVar7;
  fVar175 = pfVar7[1];
  fVar176 = pfVar7[2];
  fVar202 = pfVar7[3];
  fVar204 = *pfVar4 * 0.0;
  fVar208 = pfVar4[1] * 0.0;
  fVar222 = pfVar4[2] * 0.0;
  fVar244 = pfVar4[3] * 0.0;
  fVar203 = fVar136 * 0.0 + fVar204;
  fVar207 = fVar137 * 0.0 + fVar208;
  fVar209 = fVar138 * 0.0 + fVar222;
  fVar223 = fVar150 * 0.0 + fVar244;
  fVar320 = *pfVar3 * 0.0;
  fVar327 = pfVar3[1] * 0.0;
  fVar329 = pfVar3[2] * 0.0;
  fVar285 = pfVar3[3] * 0.0;
  fVar281 = fVar320 + fVar203 + fVar151;
  fVar289 = fVar327 + fVar207 + fVar110;
  fVar300 = fVar329 + fVar209 + fVar111;
  fVar302 = fVar285 + fVar223 + fVar112;
  fVar203 = (*pfVar3 * 3.0 + fVar203) - fVar151 * 3.0;
  fVar207 = (pfVar3[1] * 3.0 + fVar207) - fVar110 * 3.0;
  fVar209 = (pfVar3[2] * 3.0 + fVar209) - fVar111 * 3.0;
  fVar223 = (pfVar3[3] * 3.0 + fVar223) - fVar112 * 3.0;
  fVar323 = *pfVar6 * 0.0;
  fVar328 = pfVar6[1] * 0.0;
  fVar282 = pfVar6[2] * 0.0;
  fVar286 = pfVar6[3] * 0.0;
  fVar258 = fVar174 * 0.0 + fVar323;
  fVar261 = fVar175 * 0.0 + fVar328;
  fVar322 = fVar176 * 0.0 + fVar282;
  fVar228 = fVar202 * 0.0 + fVar286;
  fVar290 = *pfVar5 * 0.0;
  fVar301 = pfVar5[1] * 0.0;
  fVar303 = pfVar5[2] * 0.0;
  fVar305 = pfVar5[3] * 0.0;
  fVar307 = fVar290 + fVar258 + fVar152;
  fVar317 = fVar301 + fVar261 + fVar161;
  fVar319 = fVar303 + fVar322 + fVar162;
  fVar321 = fVar305 + fVar228 + fVar163;
  fVar304 = (*pfVar5 * 3.0 + fVar258) - fVar152 * 3.0;
  fVar306 = (pfVar5[1] * 3.0 + fVar261) - fVar161 * 3.0;
  fVar316 = (pfVar5[2] * 3.0 + fVar322) - fVar162 * 3.0;
  fVar318 = (pfVar5[3] * 3.0 + fVar228) - fVar163 * 3.0;
  fVar239 = fVar204 + fVar136 + fVar320 + fVar151 * 0.0;
  fVar241 = fVar208 + fVar137 + fVar327 + fVar110 * 0.0;
  fVar266 = fVar222 + fVar138 + fVar329 + fVar111 * 0.0;
  fVar278 = fVar244 + fVar150 + fVar285 + fVar112 * 0.0;
  fVar258 = ((fVar136 * 3.0 - *pfVar4 * 3.0) + fVar320) - fVar151 * 0.0;
  fVar261 = ((fVar137 * 3.0 - pfVar4[1] * 3.0) + fVar327) - fVar110 * 0.0;
  fVar322 = ((fVar138 * 3.0 - pfVar4[2] * 3.0) + fVar329) - fVar111 * 0.0;
  fVar228 = ((fVar150 * 3.0 - pfVar4[3] * 3.0) + fVar285) - fVar112 * 0.0;
  fVar136 = fVar323 + fVar174 + fVar290 + fVar152 * 0.0;
  fVar137 = fVar328 + fVar175 + fVar301 + fVar161 * 0.0;
  fVar138 = fVar282 + fVar176 + fVar303 + fVar162 * 0.0;
  fVar204 = fVar286 + fVar202 + fVar305 + fVar163 * 0.0;
  fVar151 = ((fVar174 * 3.0 - *pfVar6 * 3.0) + fVar290) - fVar152 * 0.0;
  fVar110 = ((fVar175 * 3.0 - pfVar6[1] * 3.0) + fVar301) - fVar161 * 0.0;
  fVar111 = ((fVar176 * 3.0 - pfVar6[2] * 3.0) + fVar303) - fVar162 * 0.0;
  fVar112 = ((fVar202 * 3.0 - pfVar6[3] * 3.0) + fVar305) - fVar163 * 0.0;
  fVar208 = fVar207 * fVar307 - fVar317 * fVar203;
  fVar244 = fVar209 * fVar317 - fVar319 * fVar207;
  fVar320 = fVar203 * fVar319 - fVar307 * fVar209;
  fVar323 = fVar223 * fVar321 - fVar321 * fVar223;
  fVar174 = fVar207 * fVar304 - fVar306 * fVar203;
  fVar176 = fVar209 * fVar306 - fVar316 * fVar207;
  fVar202 = fVar203 * fVar316 - fVar304 * fVar209;
  fVar150 = fVar261 * fVar136 - fVar137 * fVar258;
  fVar161 = fVar322 * fVar137 - fVar138 * fVar261;
  fVar162 = fVar258 * fVar138 - fVar136 * fVar322;
  fVar163 = fVar228 * fVar204 - fVar204 * fVar228;
  fVar136 = fVar261 * fVar151 - fVar110 * fVar258;
  fVar137 = fVar322 * fVar110 - fVar111 * fVar261;
  fVar111 = fVar258 * fVar111 - fVar151 * fVar322;
  fVar204 = fVar320 * fVar320 + fVar244 * fVar244 + fVar208 * fVar208;
  auVar140 = ZEXT416((uint)fVar204);
  auVar73 = rsqrtss(ZEXT416((uint)fVar204),auVar140);
  fVar151 = auVar73._0_4_;
  fVar222 = fVar151 * 1.5 - fVar151 * fVar151 * fVar204 * 0.5 * fVar151;
  fVar304 = fVar208 * fVar174 + fVar320 * fVar202 + fVar244 * fVar176;
  fVar151 = fVar323 * fVar222;
  auVar73 = rcpss(auVar140,auVar140);
  fVar175 = (2.0 - fVar204 * auVar73._0_4_) * auVar73._0_4_;
  fVar306 = fVar162 * fVar162 + fVar161 * fVar161 + fVar150 * fVar150;
  auVar73 = ZEXT416((uint)fVar306);
  auVar140 = rsqrtss(ZEXT416((uint)fVar306),auVar73);
  fVar110 = auVar140._0_4_;
  fVar152 = fVar110 * 1.5 - fVar110 * fVar110 * fVar306 * 0.5 * fVar110;
  fVar316 = fVar150 * fVar136 + fVar162 * fVar111 + fVar161 * fVar137;
  fVar138 = fVar163 * fVar152;
  auVar73 = rcpss(auVar73,auVar73);
  fVar110 = (2.0 - fVar306 * auVar73._0_4_) * auVar73._0_4_;
  fVar307 = fVar302 * fVar244 * fVar222;
  fVar321 = fVar302 * fVar320 * fVar222;
  fVar224 = fVar302 * fVar208 * fVar222;
  fVar226 = fVar302 * fVar151;
  fVar267 = fVar281 - fVar307;
  fVar279 = fVar289 - fVar321;
  fVar283 = fVar300 - fVar224;
  fVar287 = fVar302 - fVar226;
  fVar245 = fVar302 * fVar175 * (fVar204 * fVar176 - fVar304 * fVar244) * fVar222 +
            fVar223 * fVar244 * fVar222;
  fVar259 = fVar302 * fVar175 * (fVar204 * fVar202 - fVar304 * fVar320) * fVar222 +
            fVar223 * fVar320 * fVar222;
  fVar262 = fVar302 * fVar175 * (fVar204 * fVar174 - fVar304 * fVar208) * fVar222 +
            fVar223 * fVar208 * fVar222;
  fVar264 = fVar302 * fVar175 * (fVar204 * (fVar223 * fVar318 - fVar318 * fVar223) -
                                fVar304 * fVar323) * fVar222 + fVar223 * fVar151;
  fVar307 = fVar307 + fVar281;
  fVar321 = fVar321 + fVar289;
  fVar224 = fVar224 + fVar300;
  fVar226 = fVar226 + fVar302;
  fVar204 = fVar278 * fVar161 * fVar152;
  fVar208 = fVar278 * fVar162 * fVar152;
  fVar222 = fVar278 * fVar150 * fVar152;
  fVar244 = fVar278 * fVar138;
  fVar320 = fVar239 - fVar204;
  fVar328 = fVar241 - fVar208;
  fVar285 = fVar266 - fVar222;
  fVar301 = fVar278 - fVar244;
  fVar281 = fVar278 * fVar110 * (fVar306 * fVar137 - fVar316 * fVar161) * fVar152 +
            fVar228 * fVar161 * fVar152;
  fVar300 = fVar278 * fVar110 * (fVar306 * fVar111 - fVar316 * fVar162) * fVar152 +
            fVar228 * fVar162 * fVar152;
  fVar304 = fVar278 * fVar110 * (fVar306 * fVar136 - fVar316 * fVar150) * fVar152 +
            fVar228 * fVar150 * fVar152;
  fVar316 = fVar278 * fVar110 * (fVar306 * (fVar228 * fVar112 - fVar112 * fVar228) -
                                fVar316 * fVar163) * fVar152 + fVar228 * fVar138;
  fVar204 = fVar204 + fVar239;
  fVar208 = fVar208 + fVar241;
  fVar222 = fVar222 + fVar266;
  fVar244 = fVar244 + fVar278;
  lVar22 = *(long *)(_Var20 + 0x38 + lVar60);
  lVar23 = *(long *)(_Var20 + 0x48 + lVar60);
  pfVar3 = (float *)(lVar22 + lVar23 * uVar58);
  fVar151 = *pfVar3;
  fVar110 = pfVar3[1];
  fVar111 = pfVar3[2];
  fVar112 = pfVar3[3];
  pfVar3 = (float *)(lVar22 + lVar23 * lVar62);
  pfVar4 = (float *)(lVar22 + lVar23 * lVar1);
  pfVar5 = (float *)(lVar22 + lVar23 * lVar2);
  fVar136 = *pfVar5;
  fVar137 = pfVar5[1];
  fVar138 = pfVar5[2];
  fVar150 = pfVar5[3];
  lVar22 = *(long *)(lVar21 + 0x38 + lVar60);
  lVar21 = *(long *)(lVar21 + 0x48 + lVar60);
  uVar58 = uVar58 * lVar21;
  pfVar5 = (float *)(lVar22 + lVar21 * lVar2);
  fVar152 = *pfVar5;
  fVar161 = pfVar5[1];
  fVar162 = pfVar5[2];
  fVar163 = pfVar5[3];
  fVar289 = *pfVar4 * 0.0;
  fVar302 = pfVar4[1] * 0.0;
  fVar306 = pfVar4[2] * 0.0;
  fVar318 = pfVar4[3] * 0.0;
  fVar327 = fVar136 * 0.0 + fVar289;
  fVar282 = fVar137 * 0.0 + fVar302;
  fVar290 = fVar138 * 0.0 + fVar306;
  fVar305 = fVar150 * 0.0 + fVar318;
  fVar323 = *pfVar3 * 0.0;
  fVar329 = pfVar3[1] * 0.0;
  fVar286 = pfVar3[2] * 0.0;
  fVar303 = pfVar3[3] * 0.0;
  fVar239 = (*pfVar3 * 3.0 + fVar327) - fVar151 * 3.0;
  fVar241 = (pfVar3[1] * 3.0 + fVar282) - fVar110 * 3.0;
  fVar266 = (pfVar3[2] * 3.0 + fVar290) - fVar111 * 3.0;
  fVar278 = (pfVar3[3] * 3.0 + fVar305) - fVar112 * 3.0;
  pfVar3 = (float *)(lVar22 + lVar1 * lVar21);
  fVar246 = *pfVar3 * 0.0;
  fVar260 = pfVar3[1] * 0.0;
  fVar263 = pfVar3[2] * 0.0;
  fVar265 = pfVar3[3] * 0.0;
  fVar229 = fVar152 * 0.0 + fVar246;
  fVar240 = fVar161 * 0.0 + fVar260;
  fVar242 = fVar162 * 0.0 + fVar263;
  fVar243 = fVar163 * 0.0 + fVar265;
  pfVar5 = (float *)(lVar22 + lVar62 * lVar21);
  fVar268 = *pfVar5 * 0.0;
  fVar280 = pfVar5[1] * 0.0;
  fVar284 = pfVar5[2] * 0.0;
  fVar288 = pfVar5[3] * 0.0;
  pfVar6 = (float *)(lVar22 + uVar58);
  fVar174 = *pfVar6;
  fVar175 = pfVar6[1];
  fVar176 = pfVar6[2];
  fVar202 = pfVar6[3];
  fVar317 = (*pfVar5 * 3.0 + fVar229) - fVar174 * 3.0;
  fVar319 = (pfVar5[1] * 3.0 + fVar240) - fVar175 * 3.0;
  fVar225 = (pfVar5[2] * 3.0 + fVar242) - fVar176 * 3.0;
  fVar227 = (pfVar5[3] * 3.0 + fVar243) - fVar202 * 3.0;
  fVar327 = fVar323 + fVar327 + fVar151;
  fVar282 = fVar329 + fVar282 + fVar110;
  fVar290 = fVar286 + fVar290 + fVar111;
  fVar305 = fVar303 + fVar305 + fVar112;
  fVar289 = fVar289 + fVar136 + fVar323 + fVar151 * 0.0;
  fVar302 = fVar302 + fVar137 + fVar329 + fVar110 * 0.0;
  fVar306 = fVar306 + fVar138 + fVar286 + fVar111 * 0.0;
  fVar318 = fVar318 + fVar150 + fVar303 + fVar112 * 0.0;
  fVar151 = ((fVar136 * 3.0 - *pfVar4 * 3.0) + fVar323) - fVar151 * 0.0;
  fVar110 = ((fVar137 * 3.0 - pfVar4[1] * 3.0) + fVar329) - fVar110 * 0.0;
  fVar111 = ((fVar138 * 3.0 - pfVar4[2] * 3.0) + fVar286) - fVar111 * 0.0;
  fVar112 = ((fVar150 * 3.0 - pfVar4[3] * 3.0) + fVar303) - fVar112 * 0.0;
  fVar150 = fVar268 + fVar229 + fVar174;
  fVar229 = fVar280 + fVar240 + fVar175;
  fVar240 = fVar284 + fVar242 + fVar176;
  fVar242 = fVar288 + fVar243 + fVar202;
  fVar323 = fVar246 + fVar152 + fVar268 + fVar174 * 0.0;
  fVar329 = fVar260 + fVar161 + fVar280 + fVar175 * 0.0;
  fVar286 = fVar263 + fVar162 + fVar284 + fVar176 * 0.0;
  fVar303 = fVar265 + fVar163 + fVar288 + fVar202 * 0.0;
  fVar136 = ((fVar152 * 3.0 - *pfVar3 * 3.0) + fVar268) - fVar174 * 0.0;
  fVar137 = ((fVar161 * 3.0 - pfVar3[1] * 3.0) + fVar280) - fVar175 * 0.0;
  fVar138 = ((fVar162 * 3.0 - pfVar3[2] * 3.0) + fVar284) - fVar176 * 0.0;
  fVar163 = ((fVar163 * 3.0 - pfVar3[3] * 3.0) + fVar288) - fVar202 * 0.0;
  fVar162 = fVar241 * fVar150 - fVar229 * fVar239;
  fVar174 = fVar266 * fVar229 - fVar240 * fVar241;
  fVar240 = fVar239 * fVar240 - fVar150 * fVar266;
  fVar243 = fVar278 * fVar242 - fVar242 * fVar278;
  fVar150 = fVar241 * fVar317 - fVar319 * fVar239;
  fVar152 = fVar266 * fVar319 - fVar225 * fVar241;
  fVar161 = fVar239 * fVar225 - fVar317 * fVar266;
  fVar317 = fVar110 * fVar323 - fVar329 * fVar151;
  fVar225 = fVar111 * fVar329 - fVar286 * fVar110;
  fVar229 = fVar151 * fVar286 - fVar323 * fVar111;
  fVar242 = fVar112 * fVar303 - fVar303 * fVar112;
  fVar175 = fVar110 * fVar136 - fVar137 * fVar151;
  fVar202 = fVar111 * fVar137 - fVar138 * fVar110;
  fVar329 = fVar151 * fVar138 - fVar136 * fVar111;
  fVar136 = fVar240 * fVar240 + fVar174 * fVar174 + fVar162 * fVar162;
  auVar73 = ZEXT416((uint)fVar136);
  auVar140 = rsqrtss(ZEXT416((uint)fVar136),auVar73);
  fVar137 = auVar140._0_4_;
  fVar319 = fVar137 * 1.5 - fVar137 * fVar137 * fVar136 * 0.5 * fVar137;
  fVar265 = fVar162 * fVar150 + fVar240 * fVar161 + fVar174 * fVar152;
  auVar73 = rcpss(auVar73,auVar73);
  fVar137 = (2.0 - fVar136 * auVar73._0_4_) * auVar73._0_4_;
  fVar138 = fVar243 * fVar319;
  fVar246 = fVar229 * fVar229 + fVar225 * fVar225 + fVar317 * fVar317;
  auVar73 = ZEXT416((uint)fVar246);
  auVar140 = rsqrtss(ZEXT416((uint)fVar246),auVar73);
  fVar176 = auVar140._0_4_;
  fVar263 = fVar176 * 1.5 - fVar176 * fVar176 * fVar246 * 0.5 * fVar176;
  fVar268 = fVar317 * fVar175 + fVar229 * fVar329 + fVar225 * fVar202;
  auVar73 = rcpss(auVar73,auVar73);
  fVar280 = (2.0 - fVar246 * auVar73._0_4_) * auVar73._0_4_;
  fVar260 = fVar242 * fVar263;
  fVar176 = fVar305 * fVar174 * fVar319;
  fVar323 = fVar305 * fVar240 * fVar319;
  fVar286 = fVar305 * fVar162 * fVar319;
  fVar303 = fVar305 * fVar138;
  fVar152 = fVar305 * fVar137 * (fVar136 * fVar152 - fVar265 * fVar174) * fVar319 +
            fVar278 * fVar174 * fVar319;
  fVar161 = fVar305 * fVar137 * (fVar136 * fVar161 - fVar265 * fVar240) * fVar319 +
            fVar278 * fVar240 * fVar319;
  fVar162 = fVar305 * fVar137 * (fVar136 * fVar150 - fVar265 * fVar162) * fVar319 +
            fVar278 * fVar162 * fVar319;
  fVar174 = fVar305 * fVar137 * (fVar136 * (fVar278 * fVar227 - fVar227 * fVar278) -
                                fVar265 * fVar243) * fVar319 + fVar278 * fVar138;
  fVar319 = fVar327 - fVar176;
  fVar227 = fVar282 - fVar323;
  fVar240 = fVar290 - fVar286;
  fVar243 = fVar305 - fVar303;
  fVar176 = fVar176 + fVar327;
  fVar323 = fVar323 + fVar282;
  fVar286 = fVar286 + fVar290;
  fVar303 = fVar303 + fVar305;
  fVar136 = fVar318 * fVar225 * fVar263;
  fVar137 = fVar318 * fVar229 * fVar263;
  fVar138 = fVar318 * fVar317 * fVar263;
  fVar150 = fVar318 * fVar260;
  fVar282 = fVar318 * fVar280 * (fVar246 * fVar202 - fVar268 * fVar225) * fVar263 +
            fVar112 * fVar225 * fVar263;
  fVar329 = fVar318 * fVar280 * (fVar246 * fVar329 - fVar268 * fVar229) * fVar263 +
            fVar112 * fVar229 * fVar263;
  fVar290 = fVar318 * fVar280 * (fVar246 * fVar175 - fVar268 * fVar317) * fVar263 +
            fVar112 * fVar317 * fVar263;
  fVar305 = fVar318 * fVar280 * (fVar246 * (fVar112 * fVar163 - fVar163 * fVar112) -
                                fVar268 * fVar242) * fVar263 + fVar112 * fVar260;
  fVar163 = fVar289 - fVar136;
  fVar175 = fVar302 - fVar137;
  fVar202 = fVar306 - fVar138;
  fVar327 = fVar318 - fVar150;
  fVar136 = fVar136 + fVar289;
  fVar137 = fVar137 + fVar302;
  fVar138 = fVar138 + fVar306;
  fVar150 = fVar150 + fVar318;
  fVar289 = 1.0 - fVar72;
  local_388 = fVar267 * fVar289 + fVar319 * fVar72;
  fStack_384 = fVar279 * fVar289 + fVar227 * fVar72;
  fStack_380 = fVar283 * fVar289 + fVar240 * fVar72;
  fStack_37c = fVar287 * fVar289 + fVar243 * fVar72;
  local_398 = ((fVar203 - fVar245) * 0.33333334 + fVar267) * fVar289 +
              ((fVar239 - fVar152) * 0.33333334 + fVar319) * fVar72;
  fStack_394 = ((fVar207 - fVar259) * 0.33333334 + fVar279) * fVar289 +
               ((fVar241 - fVar161) * 0.33333334 + fVar227) * fVar72;
  fStack_390 = ((fVar209 - fVar262) * 0.33333334 + fVar283) * fVar289 +
               ((fVar266 - fVar162) * 0.33333334 + fVar240) * fVar72;
  fStack_38c = ((fVar223 - fVar264) * 0.33333334 + fVar287) * fVar289 +
               ((fVar278 - fVar174) * 0.33333334 + fVar243) * fVar72;
  local_3b8 = (fVar320 - (fVar258 - fVar281) * 0.33333334) * fVar289 +
              (fVar163 - (fVar151 - fVar282) * 0.33333334) * fVar72;
  fStack_3b4 = (fVar328 - (fVar261 - fVar300) * 0.33333334) * fVar289 +
               (fVar175 - (fVar110 - fVar329) * 0.33333334) * fVar72;
  fStack_3b0 = (fVar285 - (fVar322 - fVar304) * 0.33333334) * fVar289 +
               (fVar202 - (fVar111 - fVar290) * 0.33333334) * fVar72;
  fStack_3ac = (fVar301 - (fVar228 - fVar316) * 0.33333334) * fVar289 +
               (fVar327 - (fVar112 - fVar305) * 0.33333334) * fVar72;
  local_3a8 = fVar320 * fVar289 + fVar163 * fVar72;
  fStack_3a4 = fVar328 * fVar289 + fVar175 * fVar72;
  fStack_3a0 = fVar285 * fVar289 + fVar202 * fVar72;
  fStack_39c = fVar301 * fVar289 + fVar327 * fVar72;
  local_378 = fVar307 * fVar289 + fVar176 * fVar72;
  fStack_374 = fVar321 * fVar289 + fVar323 * fVar72;
  fStack_370 = fVar224 * fVar289 + fVar286 * fVar72;
  fStack_36c = fVar226 * fVar289 + fVar303 * fVar72;
  local_368 = ((fVar245 + fVar203) * 0.33333334 + fVar307) * fVar289 +
              ((fVar152 + fVar239) * 0.33333334 + fVar176) * fVar72;
  fStack_364 = ((fVar259 + fVar207) * 0.33333334 + fVar321) * fVar289 +
               ((fVar161 + fVar241) * 0.33333334 + fVar323) * fVar72;
  fStack_360 = ((fVar262 + fVar209) * 0.33333334 + fVar224) * fVar289 +
               ((fVar162 + fVar266) * 0.33333334 + fVar286) * fVar72;
  fStack_35c = ((fVar264 + fVar223) * 0.33333334 + fVar226) * fVar289 +
               ((fVar174 + fVar278) * 0.33333334 + fVar303) * fVar72;
  local_3dc.m128[1] =
       (fVar204 - (fVar281 + fVar258) * 0.33333334) * fVar289 +
       (fVar136 - (fVar282 + fVar151) * 0.33333334) * fVar72;
  local_3dc.m128[2] =
       (fVar208 - (fVar300 + fVar261) * 0.33333334) * fVar289 +
       (fVar137 - (fVar329 + fVar110) * 0.33333334) * fVar72;
  local_3dc.m128[3] =
       (fVar222 - (fVar304 + fVar322) * 0.33333334) * fVar289 +
       (fVar138 - (fVar290 + fVar111) * 0.33333334) * fVar72;
  fStack_3cc = (fVar244 - (fVar316 + fVar228) * 0.33333334) * fVar289 +
               (fVar150 - (fVar305 + fVar112) * 0.33333334) * fVar72;
  local_228 = fVar289 * fVar204 + fVar72 * fVar136;
  fStack_224 = fVar289 * fVar208 + fVar72 * fVar137;
  fStack_220 = fVar289 * fVar222 + fVar72 * fVar138;
  fStack_21c = fVar289 * fVar244 + fVar72 * fVar150;
  fVar151 = (ray->super_RayK<1>).org.field_0.m128[0];
  fVar72 = (ray->super_RayK<1>).org.field_0.m128[1];
  fVar110 = (ray->super_RayK<1>).org.field_0.m128[2];
  fVar111 = (pre->ray_space).vx.field_0.m128[0];
  fVar112 = (pre->ray_space).vx.field_0.m128[1];
  fVar136 = (pre->ray_space).vy.field_0.m128[0];
  fVar137 = (pre->ray_space).vy.field_0.m128[1];
  fVar138 = (pre->ray_space).vz.field_0.m128[0];
  fVar150 = (pre->ray_space).vz.field_0.m128[1];
  fVar162 = (local_388 - fVar151) * fVar111 +
            (fStack_384 - fVar72) * fVar136 + (fStack_380 - fVar110) * fVar138;
  fVar163 = (local_388 - fVar151) * fVar112 +
            (fStack_384 - fVar72) * fVar137 + (fStack_380 - fVar110) * fVar150;
  local_2b8 = CONCAT44(fVar163,fVar162);
  fVar152 = (local_398 - fVar151) * fVar111 +
            (fStack_394 - fVar72) * fVar136 + (fStack_390 - fVar110) * fVar138;
  fVar161 = (local_398 - fVar151) * fVar112 +
            (fStack_394 - fVar72) * fVar137 + (fStack_390 - fVar110) * fVar150;
  local_2c8 = CONCAT44(fVar161,fVar152);
  fVar204 = (local_3b8 - fVar151) * fVar111 +
            (fStack_3b4 - fVar72) * fVar136 + (fStack_3b0 - fVar110) * fVar138;
  fVar207 = (local_3b8 - fVar151) * fVar112 +
            (fStack_3b4 - fVar72) * fVar137 + (fStack_3b0 - fVar110) * fVar150;
  local_2d8 = CONCAT44(fVar207,fVar204);
  fVar202 = (local_3a8 - fVar151) * fVar111 +
            (fStack_3a4 - fVar72) * fVar136 + (fStack_3a0 - fVar110) * fVar138;
  fVar203 = (local_3a8 - fVar151) * fVar112 +
            (fStack_3a4 - fVar72) * fVar137 + (fStack_3a0 - fVar110) * fVar150;
  local_2e8 = CONCAT44(fVar203,fVar202);
  fVar176 = (local_378 - fVar151) * fVar111 +
            (fStack_374 - fVar72) * fVar136 + (fStack_370 - fVar110) * fVar138;
  fStack_2f4 = (local_378 - fVar151) * fVar112 +
               (fStack_374 - fVar72) * fVar137 + (fStack_370 - fVar110) * fVar150;
  fVar174 = (local_368 - fVar151) * fVar111 +
            (fStack_364 - fVar72) * fVar136 + (fStack_360 - fVar110) * fVar138;
  fVar175 = (local_368 - fVar151) * fVar112 +
            (fStack_364 - fVar72) * fVar137 + (fStack_360 - fVar110) * fVar150;
  uVar153 = CONCAT44(fVar175,fVar174);
  afStack_208[0] =
       (local_3dc.m128[1] - fVar151) * fVar111 +
       (local_3dc.m128[2] - fVar72) * fVar136 + (local_3dc.m128[3] - fVar110) * fVar138;
  afStack_208[1] =
       (local_3dc.m128[1] - fVar151) * fVar112 +
       (local_3dc.m128[2] - fVar72) * fVar137 + (local_3dc.m128[3] - fVar110) * fVar150;
  fVar111 = (local_228 - fVar151) * fVar111 +
            (fStack_224 - fVar72) * fVar136 + (fStack_220 - fVar110) * fVar138;
  fVar151 = (local_228 - fVar151) * fVar112 +
            (fStack_224 - fVar72) * fVar137 + (fStack_220 - fVar110) * fVar150;
  local_328 = CONCAT44(fVar151,fVar111);
  register0x00001508 = uVar153;
  local_338 = local_2c8;
  register0x00001408 = local_328;
  local_88 = local_2e8;
  auVar93._8_4_ = fVar176;
  auVar93._0_8_ = local_2b8;
  auVar93._12_4_ = fStack_2f4;
  auVar73 = minps(auVar93,_local_338);
  auVar124._8_4_ = afStack_208[0];
  auVar124._0_8_ = local_2d8;
  auVar124._12_4_ = afStack_208[1];
  auVar140 = minps(auVar124,_local_88);
  auVar73 = minps(auVar73,auVar140);
  auVar125._4_4_ = fVar163;
  auVar125._0_4_ = fVar162;
  auVar125._8_4_ = fVar176;
  auVar125._12_4_ = fStack_2f4;
  auVar140 = maxps(auVar125,_local_338);
  auVar141._4_4_ = fVar207;
  auVar141._0_4_ = fVar204;
  auVar141._8_4_ = afStack_208[0];
  auVar141._12_4_ = afStack_208[1];
  auVar142 = maxps(auVar141,_local_88);
  auVar126 = maxps(auVar140,auVar142);
  auVar25._4_8_ = auVar142._8_8_;
  auVar25._0_4_ = auVar73._4_4_;
  auVar143._0_8_ = auVar25._0_8_ << 0x20;
  auVar143._8_4_ = auVar73._8_4_;
  auVar143._12_4_ = auVar73._12_4_;
  auVar144._8_8_ = auVar73._8_8_;
  auVar144._0_8_ = auVar143._8_8_;
  auVar140 = minps(auVar73,auVar144);
  auVar26._4_8_ = auVar73._8_8_;
  auVar26._0_4_ = auVar126._4_4_;
  auVar145._0_8_ = auVar26._0_8_ << 0x20;
  auVar145._8_4_ = auVar126._8_4_;
  auVar145._12_4_ = auVar126._12_4_;
  auVar146._8_8_ = auVar126._8_8_;
  auVar146._0_8_ = auVar145._8_8_;
  auVar73 = maxps(auVar126,auVar146);
  auVar94._0_8_ = auVar140._0_8_ & 0x7fffffff7fffffff;
  auVar94._8_4_ = auVar140._8_4_ & 0x7fffffff;
  auVar94._12_4_ = auVar140._12_4_ & 0x7fffffff;
  auVar127._0_8_ = auVar73._0_8_ & 0x7fffffff7fffffff;
  auVar127._8_4_ = auVar73._8_4_ & 0x7fffffff;
  auVar127._12_4_ = auVar73._12_4_ & 0x7fffffff;
  auVar73 = maxps(auVar94,auVar127);
  fStack_94 = auVar73._4_4_;
  local_98 = fStack_94;
  if (fStack_94 <= auVar73._0_4_) {
    local_98 = auVar73._0_4_;
  }
  lVar62 = (ulong)uVar65 + 0xf;
  local_98 = local_98 * 9.536743e-07;
  register0x00001488 = local_2b8;
  register0x00001388 = local_2c8;
  register0x000015c8 = local_2d8;
  register0x00001588 = local_2e8;
  register0x00001288 = uVar153;
  local_308 = uVar153;
  register0x00001348 = local_328;
  fStack_90 = fStack_94;
  fStack_8c = fStack_94;
  local_158 = local_98;
  fStack_154 = local_98;
  fStack_150 = local_98;
  fStack_14c = local_98;
  local_168 = -local_98;
  fStack_164 = -local_98;
  fStack_160 = -local_98;
  fStack_15c = -local_98;
  local_3e8 = CONCAT44(fStack_2f4,fVar176);
  local_a8 = fVar152 - fVar162;
  fStack_a4 = fVar161 - fVar163;
  fStack_a0 = fVar174 - fVar176;
  fStack_9c = fVar175 - fStack_2f4;
  local_b8 = fVar204 - fVar152;
  fStack_b4 = fVar207 - fVar161;
  fStack_b0 = afStack_208[0] - fVar174;
  fStack_ac = afStack_208[1] - fVar175;
  local_218 = local_2d8;
  local_c8 = fVar202 - fVar204;
  fStack_c4 = fVar203 - fVar207;
  fStack_c0 = fVar111 - afStack_208[0];
  fStack_bc = fVar151 - afStack_208[1];
  local_188 = local_378 - local_388;
  fStack_184 = fStack_374 - fStack_384;
  fStack_180 = fStack_370 - fStack_380;
  fStack_17c = fStack_36c - fStack_37c;
  local_198 = local_368 - local_398;
  fStack_194 = fStack_364 - fStack_394;
  fStack_190 = fStack_360 - fStack_390;
  fStack_18c = fStack_35c - fStack_38c;
  local_1a8 = local_3dc.m128[1] - local_3b8;
  fStack_1a4 = local_3dc.m128[2] - fStack_3b4;
  fStack_1a0 = local_3dc.m128[3] - fStack_3b0;
  fStack_19c = fStack_3cc - fStack_3ac;
  local_1b8 = local_228 - local_3a8;
  fStack_1b4 = fStack_224 - fStack_3a4;
  fStack_1b0 = fStack_220 - fStack_3a0;
  fStack_1ac = fStack_21c - fStack_39c;
  uVar63 = 0;
  fVar151 = 0.0;
  fVar72 = 1.0;
  fVar110 = 0.0;
  fVar111 = 1.0;
  fStack_3c0 = 0.0;
  fStack_3bc = 0.0;
  local_2f8 = fVar176;
  fStack_2f0 = fVar176;
  fStack_2ec = fStack_2f4;
  local_318 = afStack_208[0];
  fStack_314 = afStack_208[1];
  fStack_310 = afStack_208[0];
  fStack_30c = afStack_208[1];
LAB_00aed8de:
  do {
    fVar112 = 1.0 - fVar151;
    fVar136 = 1.0 - fVar151;
    fVar137 = 1.0 - fVar72;
    fVar138 = 1.0 - fVar72;
    fVar222 = local_2b8._0_4_ * fVar112 + local_2f8 * fVar151;
    fVar228 = local_2b8._4_4_ * fVar136 + fStack_2f4 * fVar151;
    fVar239 = local_2b8._8_4_ * fVar137 + fStack_2f0 * fVar72;
    fVar278 = local_2b8._12_4_ * fVar138 + fStack_2ec * fVar72;
    fVar161 = local_2c8._0_4_ * fVar112 + local_308._0_4_ * fVar151;
    fVar258 = local_2c8._4_4_ * fVar136 + local_308._4_4_ * fVar151;
    fVar261 = local_2c8._8_4_ * fVar137 + local_308._8_4_ * fVar72;
    fVar322 = local_2c8._12_4_ * fVar138 + local_308._12_4_ * fVar72;
    fVar316 = local_2d8._0_4_ * fVar112 + local_318 * fVar151;
    fVar318 = local_2d8._4_4_ * fVar136 + fStack_314 * fVar151;
    fVar320 = local_2d8._8_4_ * fVar137 + fStack_310 * fVar72;
    fVar323 = local_2d8._12_4_ * fVar138 + fStack_30c * fVar72;
    fVar241 = fVar112 * local_2e8._0_4_ + fVar151 * local_328._0_4_;
    fVar266 = fVar136 * local_2e8._4_4_ + fVar151 * local_328._4_4_;
    fVar281 = fVar137 * local_2e8._8_4_ + fVar72 * local_328._8_4_;
    fVar289 = fVar138 * local_2e8._12_4_ + fVar72 * local_328._12_4_;
    fVar300 = (fVar111 - fVar110) * 0.11111111;
    local_3c8 = CONCAT44(fVar111,fVar110);
    fVar302 = (fVar111 - fVar110) * 0.0 + fVar110;
    fVar304 = (fVar111 - fVar110) * 0.33333334 + fVar110;
    fVar306 = (fVar111 - fVar110) * 0.6666667 + fVar110;
    fVar110 = (fVar111 - fVar110) * 1.0 + fVar110;
    fVar111 = 1.0 - fVar302;
    fVar112 = 1.0 - fVar304;
    fVar136 = 1.0 - fVar306;
    fVar152 = 1.0 - fVar110;
    fVar174 = fVar161 * fVar111 + fVar316 * fVar302;
    fVar175 = fVar161 * fVar112 + fVar316 * fVar304;
    fVar202 = fVar161 * fVar136 + fVar316 * fVar306;
    fVar203 = fVar161 * fVar152 + fVar316 * fVar110;
    fVar204 = fVar258 * fVar111 + fVar318 * fVar302;
    fVar207 = fVar258 * fVar112 + fVar318 * fVar304;
    fVar208 = fVar258 * fVar136 + fVar318 * fVar306;
    fVar209 = fVar258 * fVar152 + fVar318 * fVar110;
    fVar137 = (fVar222 * fVar111 + fVar161 * fVar302) * fVar111 + fVar302 * fVar174;
    fVar138 = (fVar222 * fVar112 + fVar161 * fVar304) * fVar112 + fVar304 * fVar175;
    fVar150 = (fVar222 * fVar136 + fVar161 * fVar306) * fVar136 + fVar306 * fVar202;
    fVar161 = (fVar222 * fVar152 + fVar161 * fVar110) * fVar152 + fVar110 * fVar203;
    fVar222 = (fVar228 * fVar111 + fVar258 * fVar302) * fVar111 + fVar302 * fVar204;
    fVar223 = (fVar228 * fVar112 + fVar258 * fVar304) * fVar112 + fVar304 * fVar207;
    fVar244 = (fVar228 * fVar136 + fVar258 * fVar306) * fVar136 + fVar306 * fVar208;
    fVar258 = (fVar228 * fVar152 + fVar258 * fVar110) * fVar152 + fVar110 * fVar209;
    fVar174 = fVar174 * fVar111 + (fVar316 * fVar111 + fVar241 * fVar302) * fVar302;
    fVar175 = fVar175 * fVar112 + (fVar316 * fVar112 + fVar241 * fVar304) * fVar304;
    fVar202 = fVar202 * fVar136 + (fVar316 * fVar136 + fVar241 * fVar306) * fVar306;
    fVar203 = fVar203 * fVar152 + (fVar316 * fVar152 + fVar241 * fVar110) * fVar110;
    fVar204 = fVar204 * fVar111 + (fVar318 * fVar111 + fVar266 * fVar302) * fVar302;
    fVar207 = fVar207 * fVar112 + (fVar318 * fVar112 + fVar266 * fVar304) * fVar304;
    fVar208 = fVar208 * fVar136 + (fVar318 * fVar136 + fVar266 * fVar306) * fVar306;
    fVar209 = fVar209 * fVar152 + (fVar318 * fVar152 + fVar266 * fVar110) * fVar110;
    local_268 = fVar111 * fVar137 + fVar302 * fVar174;
    fStack_264 = fVar112 * fVar138 + fVar304 * fVar175;
    fStack_260 = fVar136 * fVar150 + fVar306 * fVar202;
    fStack_25c = fVar152 * fVar161 + fVar110 * fVar203;
    local_148 = fVar111 * fVar222 + fVar302 * fVar204;
    fStack_144 = fVar112 * fVar223 + fVar304 * fVar207;
    fStack_140 = fVar136 * fVar244 + fVar306 * fVar208;
    fStack_13c = fVar152 * fVar258 + fVar110 * fVar209;
    fVar138 = (fVar175 - fVar138) * 3.0 * fVar300;
    fVar150 = (fVar202 - fVar150) * 3.0 * fVar300;
    fVar161 = (fVar203 - fVar161) * 3.0 * fVar300;
    fVar175 = (fVar207 - fVar223) * 3.0 * fVar300;
    fVar202 = (fVar208 - fVar244) * 3.0 * fVar300;
    fVar203 = (fVar209 - fVar258) * 3.0 * fVar300;
    local_238._4_4_ = fStack_260;
    local_238._0_4_ = fStack_264;
    local_238._8_4_ = fStack_25c;
    local_238._12_4_ = 0;
    local_e8._4_4_ = fStack_140;
    local_e8._0_4_ = fStack_144;
    local_248 = local_268 + (fVar174 - fVar137) * 3.0 * fVar300;
    fStack_244 = fStack_264 + fVar138;
    fStack_240 = fStack_260 + fVar150;
    fStack_23c = fStack_25c + fVar161;
    local_358._0_4_ = local_148 + (fVar204 - fVar222) * 3.0 * fVar300;
    local_358._4_4_ = fStack_144 + fVar175;
    fStack_350 = fStack_140 + fVar202;
    fStack_34c = fStack_13c + fVar203;
    local_258._0_4_ = fStack_264 - fVar138;
    local_258._4_4_ = fStack_260 - fVar150;
    local_258._8_4_ = fStack_25c - fVar161;
    local_258._12_4_ = 0;
    auVar95._0_4_ = fStack_144 - fVar175;
    auVar95._4_4_ = fStack_140 - fVar202;
    auVar95._8_4_ = fStack_13c - fVar203;
    auVar95._12_4_ = 0;
    fVar137 = fVar261 * fVar111 + fVar320 * fVar302;
    fVar138 = fVar261 * fVar112 + fVar320 * fVar304;
    fVar150 = fVar261 * fVar136 + fVar320 * fVar306;
    fVar161 = fVar261 * fVar152 + fVar320 * fVar110;
    fVar174 = fVar322 * fVar111 + fVar323 * fVar302;
    fVar175 = fVar322 * fVar112 + fVar323 * fVar304;
    fVar202 = fVar322 * fVar136 + fVar323 * fVar306;
    fVar228 = fVar322 * fVar152 + fVar323 * fVar110;
    fVar203 = (fVar239 * fVar111 + fVar261 * fVar302) * fVar111 + fVar302 * fVar137;
    fVar204 = (fVar239 * fVar112 + fVar261 * fVar304) * fVar112 + fVar304 * fVar138;
    fVar207 = (fVar239 * fVar136 + fVar261 * fVar306) * fVar136 + fVar306 * fVar150;
    fVar208 = (fVar239 * fVar152 + fVar261 * fVar110) * fVar152 + fVar110 * fVar161;
    fVar239 = (fVar278 * fVar111 + fVar322 * fVar302) * fVar111 + fVar302 * fVar174;
    fVar241 = (fVar278 * fVar112 + fVar322 * fVar304) * fVar112 + fVar304 * fVar175;
    fVar266 = (fVar278 * fVar136 + fVar322 * fVar306) * fVar136 + fVar306 * fVar202;
    fVar278 = (fVar278 * fVar152 + fVar322 * fVar110) * fVar152 + fVar110 * fVar228;
    fVar209 = fVar137 * fVar111 + (fVar320 * fVar111 + fVar281 * fVar302) * fVar302;
    fVar222 = fVar138 * fVar112 + (fVar320 * fVar112 + fVar281 * fVar304) * fVar304;
    fVar223 = fVar150 * fVar136 + (fVar320 * fVar136 + fVar281 * fVar306) * fVar306;
    fVar244 = fVar161 * fVar152 + (fVar320 * fVar152 + fVar281 * fVar110) * fVar110;
    fVar258 = fVar174 * fVar111 + (fVar323 * fVar111 + fVar289 * fVar302) * fVar302;
    fVar261 = fVar175 * fVar112 + (fVar323 * fVar112 + fVar289 * fVar304) * fVar304;
    fVar322 = fVar202 * fVar136 + (fVar323 * fVar136 + fVar289 * fVar306) * fVar306;
    fVar228 = fVar228 * fVar152 + (fVar323 * fVar152 + fVar289 * fVar110) * fVar110;
    fVar161 = fVar111 * fVar203 + fVar302 * fVar209;
    fVar174 = fVar112 * fVar204 + fVar304 * fVar222;
    fVar175 = fVar136 * fVar207 + fVar306 * fVar223;
    fVar202 = fVar152 * fVar208 + fVar110 * fVar244;
    fVar137 = fVar111 * fVar239 + fVar302 * fVar258;
    fVar138 = fVar112 * fVar241 + fVar304 * fVar261;
    fVar150 = fVar136 * fVar266 + fVar306 * fVar322;
    fVar152 = fVar152 * fVar278 + fVar110 * fVar228;
    fVar110 = (fVar222 - fVar204) * 3.0 * fVar300;
    fVar111 = (fVar223 - fVar207) * 3.0 * fVar300;
    fVar112 = (fVar244 - fVar208) * 3.0 * fVar300;
    fVar136 = (fVar261 - fVar241) * 3.0 * fVar300;
    fVar204 = (fVar322 - fVar266) * 3.0 * fVar300;
    fVar207 = (fVar228 - fVar278) * 3.0 * fVar300;
    local_f8._4_4_ = fVar175;
    local_f8._0_4_ = fVar174;
    local_f8._8_4_ = fVar202;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar150;
    local_118._0_4_ = fVar138;
    local_118._8_4_ = fVar152;
    local_118._12_4_ = 0;
    local_138 = fVar161 + (fVar209 - fVar203) * 3.0 * fVar300;
    fStack_134 = fVar174 + fVar110;
    fStack_130 = fVar175 + fVar111;
    fStack_12c = fVar202 + fVar112;
    local_108 = fVar137 + (fVar258 - fVar239) * 3.0 * fVar300;
    fStack_104 = fVar138 + fVar136;
    fStack_100 = fVar150 + fVar204;
    fStack_fc = fVar152 + fVar207;
    local_d8._0_4_ = fVar174 - fVar110;
    local_d8._4_4_ = fVar175 - fVar111;
    local_d8._8_4_ = fVar202 - fVar112;
    local_d8._12_4_ = 0;
    local_128._0_4_ = fVar138 - fVar136;
    local_128._4_4_ = fVar150 - fVar204;
    local_128._8_4_ = fVar152 - fVar207;
    local_128._12_4_ = 0;
    fVar110 = (fVar174 - fStack_264) + (fVar161 - local_268);
    fVar111 = (fVar175 - fStack_260) + (fVar174 - fStack_264);
    fVar112 = (fVar202 - fStack_25c) + (fVar175 - fStack_260);
    fVar136 = (fVar202 - fStack_25c) + 0.0;
    local_e8._8_4_ = fStack_13c;
    local_e8._12_4_ = 0;
    fVar203 = (fVar138 - fStack_144) + (fVar137 - local_148);
    fVar204 = (fVar150 - fStack_140) + (fVar138 - fStack_144);
    fVar207 = (fVar152 - fStack_13c) + (fVar150 - fStack_140);
    fVar208 = (fVar152 - fStack_13c) + 0.0;
    auVar215._0_8_ =
         CONCAT44(fStack_144 * fVar111 - fStack_264 * fVar204,
                  local_148 * fVar110 - local_268 * fVar203);
    auVar215._8_4_ = fStack_140 * fVar112 - fStack_260 * fVar207;
    auVar215._12_4_ = fStack_13c * fVar136 - fStack_25c * fVar208;
    auVar164._0_4_ = (float)local_358._0_4_ * fVar110 - local_248 * fVar203;
    auVar164._4_4_ = (float)local_358._4_4_ * fVar111 - fStack_244 * fVar204;
    auVar164._8_4_ = fStack_350 * fVar112 - fStack_240 * fVar207;
    auVar164._12_4_ = fStack_34c * fVar136 - fStack_23c * fVar208;
    auVar193._0_8_ =
         CONCAT44(auVar95._4_4_ * fVar111 - fVar204 * local_258._4_4_,
                  auVar95._0_4_ * fVar110 - fVar203 * local_258._0_4_);
    auVar193._8_4_ = auVar95._8_4_ * fVar112 - fVar207 * local_258._8_4_;
    auVar193._12_4_ = fVar136 * 0.0 - fVar208 * 0.0;
    auVar313._0_4_ = fVar110 * fStack_144 - fVar203 * fStack_264;
    auVar313._4_4_ = fVar111 * fStack_140 - fVar204 * fStack_260;
    auVar313._8_4_ = fVar112 * fStack_13c - fVar207 * fStack_25c;
    auVar313._12_4_ = fVar136 * 0.0 - fVar208 * 0.0;
    auVar251._0_8_ =
         CONCAT44(fVar138 * fVar111 - fVar174 * fVar204,fVar137 * fVar110 - fVar161 * fVar203);
    auVar251._8_4_ = fVar150 * fVar112 - fVar175 * fVar207;
    auVar251._12_4_ = fVar152 * fVar136 - fVar202 * fVar208;
    auVar325._0_4_ = local_108 * fVar110 - local_138 * fVar203;
    auVar325._4_4_ = fStack_104 * fVar111 - fStack_134 * fVar204;
    auVar325._8_4_ = fStack_100 * fVar112 - fStack_130 * fVar207;
    auVar325._12_4_ = fStack_fc * fVar136 - fStack_12c * fVar208;
    auVar230._0_8_ =
         CONCAT44(local_128._4_4_ * fVar111 - fVar204 * local_d8._4_4_,
                  local_128._0_4_ * fVar110 - fVar203 * local_d8._0_4_);
    auVar230._8_4_ = local_128._8_4_ * fVar112 - fVar207 * local_d8._8_4_;
    auVar230._12_4_ = fVar136 * 0.0 - fVar208 * 0.0;
    auVar96._0_4_ = fVar110 * fVar138 - fVar203 * fVar174;
    auVar96._4_4_ = fVar111 * fVar150 - fVar204 * fVar175;
    auVar96._8_4_ = fVar112 * fVar152 - fVar207 * fVar202;
    auVar96._12_4_ = fVar136 * 0.0 - fVar208 * 0.0;
    auVar128._8_4_ = auVar215._8_4_;
    auVar128._0_8_ = auVar215._0_8_;
    auVar128._12_4_ = auVar215._12_4_;
    auVar73 = minps(auVar128,auVar164);
    auVar126 = maxps(auVar215,auVar164);
    auVar165._8_4_ = auVar193._8_4_;
    auVar165._0_8_ = auVar193._0_8_;
    auVar165._12_4_ = auVar193._12_4_;
    auVar140 = minps(auVar165,auVar313);
    auVar73 = minps(auVar73,auVar140);
    auVar140 = maxps(auVar193,auVar313);
    auVar142 = maxps(auVar126,auVar140);
    auVar166._8_4_ = auVar251._8_4_;
    auVar166._0_8_ = auVar251._0_8_;
    auVar166._12_4_ = auVar251._12_4_;
    auVar140 = minps(auVar166,auVar325);
    auVar252 = maxps(auVar251,auVar325);
    auVar194._8_4_ = auVar230._8_4_;
    auVar194._0_8_ = auVar230._0_8_;
    auVar194._12_4_ = auVar230._12_4_;
    auVar126 = minps(auVar194,auVar96);
    auVar140 = minps(auVar140,auVar126);
    auVar73 = minps(auVar73,auVar140);
    auVar140 = maxps(auVar230,auVar96);
    auVar140 = maxps(auVar252,auVar140);
    auVar140 = maxps(auVar142,auVar140);
    auVar216._0_4_ =
         -(uint)(local_168 <= auVar140._0_4_ && auVar73._0_4_ <= local_158) & local_178._0_4_;
    auVar216._4_4_ =
         -(uint)(fStack_164 <= auVar140._4_4_ && auVar73._4_4_ <= fStack_154) & local_178._4_4_;
    auVar216._8_4_ =
         -(uint)(fStack_160 <= auVar140._8_4_ && auVar73._8_4_ <= fStack_150) & local_178._8_4_;
    auVar216._12_4_ =
         -(uint)(fStack_15c <= auVar140._12_4_ && auVar73._12_4_ <= fStack_14c) & local_178._12_4_;
    uVar67 = movmskps((int)uVar58,auVar216);
    paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar67;
    if (uVar67 != 0) {
      fVar110 = (fVar174 - fVar161) + (fStack_264 - local_268);
      fVar111 = (fVar175 - fVar174) + (fStack_260 - fStack_264);
      fVar112 = (fVar202 - fVar175) + (fStack_25c - fStack_260);
      fVar136 = (0.0 - fVar202) + (0.0 - fStack_25c);
      fVar203 = (fVar138 - fVar137) + (fStack_144 - local_148);
      fVar204 = (fVar150 - fVar138) + (fStack_140 - fStack_144);
      fVar207 = (fVar152 - fVar150) + (fStack_13c - fStack_140);
      fVar208 = (0.0 - fVar152) + (0.0 - fStack_13c);
      auVar330._0_8_ =
           CONCAT44(fStack_144 * fVar111 - fStack_264 * fVar204,
                    local_148 * fVar110 - local_268 * fVar203);
      auVar330._8_4_ = fStack_140 * fVar112 - fStack_260 * fVar207;
      auVar330._12_4_ = fStack_13c * fVar136 - fStack_25c * fVar208;
      auVar167._0_4_ = (float)local_358._0_4_ * fVar110 - local_248 * fVar203;
      auVar167._4_4_ = (float)local_358._4_4_ * fVar111 - fStack_244 * fVar204;
      auVar167._8_4_ = fStack_350 * fVar112 - fStack_240 * fVar207;
      auVar167._12_4_ = fStack_34c * fVar136 - fStack_23c * fVar208;
      auVar231._0_8_ =
           CONCAT44(auVar95._4_4_ * fVar111 - local_258._4_4_ * fVar204,
                    auVar95._0_4_ * fVar110 - local_258._0_4_ * fVar203);
      auVar231._8_4_ = auVar95._8_4_ * fVar112 - local_258._8_4_ * fVar207;
      auVar231._12_4_ = fVar136 * 0.0 - fVar208 * 0.0;
      auVar195._0_4_ = fStack_144 * fVar110 - fStack_264 * fVar203;
      auVar195._4_4_ = fStack_140 * fVar111 - fStack_260 * fVar204;
      auVar195._8_4_ = fStack_13c * fVar112 - fStack_25c * fVar207;
      auVar195._12_4_ = fVar136 * 0.0 - fVar208 * 0.0;
      auVar147._0_8_ =
           CONCAT44(fVar138 * fVar111 - fVar174 * fVar204,fVar137 * fVar110 - fVar161 * fVar203);
      auVar147._8_4_ = fVar150 * fVar112 - fVar175 * fVar207;
      auVar147._12_4_ = fVar152 * fVar136 - fVar202 * fVar208;
      auVar273._0_4_ = local_108 * fVar110 - local_138 * fVar203;
      auVar273._4_4_ = fStack_104 * fVar111 - fStack_134 * fVar204;
      auVar273._8_4_ = fStack_100 * fVar112 - fStack_130 * fVar207;
      auVar273._12_4_ = fStack_fc * fVar136 - fStack_12c * fVar208;
      auVar314._0_8_ =
           CONCAT44(local_128._4_4_ * fVar111 - local_d8._4_4_ * fVar204,
                    local_128._0_4_ * fVar110 - local_d8._0_4_ * fVar203);
      auVar314._8_4_ = local_128._8_4_ * fVar112 - local_d8._8_4_ * fVar207;
      auVar314._12_4_ = fVar136 * 0.0 - fVar208 * 0.0;
      auVar97._0_4_ = fVar110 * fVar138 - fVar203 * fVar174;
      auVar97._4_4_ = fVar111 * fVar150 - fVar204 * fVar175;
      auVar97._8_4_ = fVar112 * fVar152 - fVar207 * fVar202;
      auVar97._12_4_ = fVar136 * 0.0 - fVar208 * 0.0;
      auVar129._8_4_ = auVar330._8_4_;
      auVar129._0_8_ = auVar330._0_8_;
      auVar129._12_4_ = auVar330._12_4_;
      auVar73 = minps(auVar129,auVar167);
      auVar126 = maxps(auVar330,auVar167);
      auVar168._8_4_ = auVar231._8_4_;
      auVar168._0_8_ = auVar231._0_8_;
      auVar168._12_4_ = auVar231._12_4_;
      auVar140 = minps(auVar168,auVar195);
      auVar73 = minps(auVar73,auVar140);
      auVar140 = maxps(auVar231,auVar195);
      auVar252 = maxps(auVar126,auVar140);
      auVar169._8_4_ = auVar147._8_4_;
      auVar169._0_8_ = auVar147._0_8_;
      auVar169._12_4_ = auVar147._12_4_;
      auVar126 = minps(auVar169,auVar273);
      auVar140 = maxps(auVar147,auVar273);
      auVar196._8_4_ = auVar314._8_4_;
      auVar196._0_8_ = auVar314._0_8_;
      auVar196._12_4_ = auVar314._12_4_;
      auVar142 = minps(auVar196,auVar97);
      auVar126 = minps(auVar126,auVar142);
      auVar73 = minps(auVar73,auVar126);
      auVar126 = maxps(auVar314,auVar97);
      auVar140 = maxps(auVar140,auVar126);
      auVar140 = maxps(auVar252,auVar140);
      auVar331._0_4_ =
           -(uint)(local_168 <= auVar140._0_4_ && auVar73._0_4_ <= local_158) & auVar216._0_4_;
      auVar331._4_4_ =
           -(uint)(fStack_164 <= auVar140._4_4_ && auVar73._4_4_ <= fStack_154) & auVar216._4_4_;
      auVar331._8_4_ =
           -(uint)(fStack_160 <= auVar140._8_4_ && auVar73._8_4_ <= fStack_150) & auVar216._8_4_;
      auVar331._12_4_ =
           -(uint)(fStack_15c <= auVar140._12_4_ && auVar73._12_4_ <= fStack_14c) & auVar216._12_4_;
      uVar67 = movmskps(uVar67,auVar331);
      paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar67;
      auVar325 = local_118;
      if (uVar67 != 0) {
        paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)(byte)uVar67;
        afStack_208[uVar63] = (float)(uVar67 & 0xff);
        *(long *)(afStack_78 + uVar63 * 2) = local_3c8;
        *(ulong *)(afStack_58 + uVar63 * 2) = CONCAT44(fVar72,fVar151);
        uVar63 = (ulong)((int)uVar63 + 1);
      }
    }
LAB_00aedf4b:
    _local_418 = auVar95;
    auVar73 = _local_418;
    if ((int)uVar63 == 0) {
      fVar151 = (ray->super_RayK<1>).tfar;
      auVar135._4_4_ = -(uint)(fStack_1c4 <= fVar151);
      auVar135._0_4_ = -(uint)(local_1c8 <= fVar151);
      auVar135._8_4_ = -(uint)(fStack_1c0 <= fVar151);
      auVar135._12_4_ = -(uint)(fStack_1bc <= fVar151);
      uVar67 = movmskps((int)paVar59,auVar135);
      uVar65 = uVar65 & (uint)lVar62 & uVar67;
      if (uVar65 == 0) {
        return;
      }
      goto LAB_00aecc1c;
    }
    uVar67 = (int)uVar63 - 1;
    uVar58 = (ulong)uVar67;
    fVar110 = afStack_208[uVar58];
    fVar151 = afStack_58[uVar58 * 2];
    fVar72 = afStack_58[uVar58 * 2 + 1];
    uVar9 = 0;
    if (fVar110 != 0.0) {
      for (; ((uint)fVar110 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
      }
    }
    fVar110 = (float)((int)fVar110 - 1U & (uint)fVar110);
    afStack_208[uVar58] = fVar110;
    if (fVar110 == 0.0) {
      uVar63 = (ulong)uVar67;
    }
    fVar111 = (float)(uVar9 + 1) * 0.33333334;
    fVar112 = afStack_78[uVar58 * 2];
    fVar136 = afStack_78[uVar58 * 2 + 1];
    fVar110 = fVar112 * (1.0 - (float)uVar9 * 0.33333334) + fVar136 * (float)uVar9 * 0.33333334;
    fVar111 = fVar112 * (1.0 - fVar111) + fVar136 * fVar111;
    fStack_3c0 = fVar112 * 0.0 + fVar136 * 0.0;
    fStack_3bc = fVar112 * 0.0 + fVar136 * 0.0;
    fVar112 = fVar111 - fVar110;
    if (fVar112 < 0.16666667) {
      fVar202 = 1.0 - fVar151;
      fVar203 = 1.0 - fVar151;
      fVar207 = 1.0 - fVar72;
      fVar208 = 1.0 - fVar72;
      fVar138 = (float)local_2b8._0_4_ * fVar202 + local_2f8 * fVar151;
      fVar152 = (float)local_2b8._4_4_ * fVar203 + fStack_2f4 * fVar151;
      fVar174 = fStack_2b0 * fVar207 + fStack_2f0 * fVar72;
      fVar175 = fStack_2ac * fVar208 + fStack_2ec * fVar72;
      fVar136 = (float)local_2c8._0_4_ * fVar202 + (float)local_308._0_4_ * fVar151;
      fVar137 = (float)local_2c8._4_4_ * fVar203 + (float)local_308._4_4_ * fVar151;
      fVar150 = fStack_2c0 * fVar207 + fStack_300 * fVar72;
      fVar161 = fStack_2bc * fVar208 + fStack_2fc * fVar72;
      fVar222 = (float)local_2d8._0_4_ * fVar202 + local_318 * fVar151;
      fVar244 = (float)local_2d8._4_4_ * fVar203 + fStack_314 * fVar151;
      fVar261 = fStack_2d0 * fVar207 + fStack_310 * fVar72;
      fVar228 = fStack_2cc * fVar208 + fStack_30c * fVar72;
      local_3c8 = CONCAT44(fVar111,fVar110);
      fVar204 = (fVar202 * (float)local_2e8._0_4_ + fVar151 * (float)local_328._0_4_) - fVar222;
      fVar151 = (fVar203 * (float)local_2e8._4_4_ + fVar151 * (float)local_328._4_4_) - fVar244;
      fVar207 = (fVar207 * fStack_2e0 + fVar72 * fStack_320) - fVar261;
      fVar208 = (fVar208 * fStack_2dc + fVar72 * fStack_31c) - fVar228;
      fVar72 = fVar110 * (fVar222 - fVar136) + fVar136;
      fVar202 = fVar110 * (fVar244 - fVar137) + fVar137;
      fVar203 = fVar110 * (fVar261 - fVar150) + fVar150;
      fVar209 = fVar110 * (fVar228 - fVar161) + fVar161;
      fVar223 = (fVar222 - fVar136) * fVar111 + fVar136;
      fVar258 = (fVar244 - fVar137) * fVar111 + fVar137;
      fVar322 = (fVar261 - fVar150) * fVar111 + fVar150;
      fVar239 = (fVar228 - fVar161) * fVar111 + fVar161;
      fVar241 = fVar110 * (fVar136 - fVar138) + fVar138;
      fVar266 = fVar110 * (fVar137 - fVar152) + fVar152;
      fVar278 = fVar110 * (fVar150 - fVar174) + fVar174;
      fVar281 = fVar110 * (fVar161 - fVar175) + fVar175;
      auVar232._0_4_ = (fVar72 - fVar241) * fVar110 + fVar241;
      auVar232._4_4_ = (fVar202 - fVar266) * fVar110 + fVar266;
      auVar232._8_4_ = (fVar203 - fVar278) * fVar110 + fVar278;
      auVar232._12_4_ = (fVar209 - fVar281) * fVar110 + fVar281;
      fVar72 = (((fVar110 * fVar204 + fVar222) - fVar72) * fVar110 + fVar72) - auVar232._0_4_;
      fVar202 = (((fVar110 * fVar151 + fVar244) - fVar202) * fVar110 + fVar202) - auVar232._4_4_;
      fVar203 = (((fVar110 * fVar207 + fVar261) - fVar203) * fVar110 + fVar203) - auVar232._8_4_;
      fVar209 = (((fVar110 * fVar208 + fVar228) - fVar209) * fVar110 + fVar209) - auVar232._12_4_;
      auVar148._0_4_ = fVar110 * fVar72 + auVar232._0_4_;
      auVar148._4_4_ = fVar110 * fVar202 + auVar232._4_4_;
      auVar148._8_4_ = fVar110 * fVar203 + auVar232._8_4_;
      auVar148._12_4_ = fVar110 * fVar209 + auVar232._12_4_;
      fVar138 = (fVar136 - fVar138) * fVar111 + fVar138;
      fVar152 = (fVar137 - fVar152) * fVar111 + fVar152;
      fVar174 = (fVar150 - fVar174) * fVar111 + fVar174;
      fVar175 = (fVar161 - fVar175) * fVar111 + fVar175;
      fVar138 = (fVar223 - fVar138) * fVar111 + fVar138;
      fVar152 = (fVar258 - fVar152) * fVar111 + fVar152;
      fVar174 = (fVar322 - fVar174) * fVar111 + fVar174;
      fVar175 = (fVar239 - fVar175) * fVar111 + fVar175;
      fVar136 = (((fVar204 * fVar111 + fVar222) - fVar223) * fVar111 + fVar223) - fVar138;
      fVar137 = (((fVar151 * fVar111 + fVar244) - fVar258) * fVar111 + fVar258) - fVar152;
      fVar150 = (((fVar207 * fVar111 + fVar261) - fVar322) * fVar111 + fVar322) - fVar174;
      fVar161 = (((fVar208 * fVar111 + fVar228) - fVar239) * fVar111 + fVar239) - fVar175;
      fVar138 = fVar111 * fVar136 + fVar138;
      fVar152 = fVar111 * fVar137 + fVar152;
      fVar174 = fVar111 * fVar150 + fVar174;
      fVar175 = fVar111 * fVar161 + fVar175;
      fVar151 = fVar112 * 0.33333334;
      fVar204 = fVar72 * 3.0 * fVar151 + auVar148._0_4_;
      fVar207 = fVar202 * 3.0 * fVar151 + auVar148._4_4_;
      fVar208 = fVar203 * 3.0 * fVar151 + auVar148._8_4_;
      fVar209 = fVar209 * 3.0 * fVar151 + auVar148._12_4_;
      fVar222 = fVar138 - fVar151 * fVar136 * 3.0;
      fVar223 = fVar152 - fVar151 * fVar137 * 3.0;
      fVar244 = fVar174 - fVar151 * fVar150 * 3.0;
      fVar258 = fVar175 - fVar151 * fVar161 * 3.0;
      auVar27._4_8_ = auVar325._8_8_;
      auVar27._0_4_ = auVar148._4_4_;
      auVar324._0_8_ = auVar27._0_8_ << 0x20;
      auVar324._8_4_ = auVar148._8_4_;
      auVar324._12_4_ = auVar148._12_4_;
      auVar325._8_8_ = auVar148._8_8_;
      auVar325._0_8_ = auVar324._8_8_;
      auVar28._4_8_ = auVar232._8_8_;
      auVar28._0_4_ = fVar152;
      auVar233._0_8_ = auVar28._0_8_ << 0x20;
      auVar233._8_4_ = fVar174;
      auVar233._12_4_ = fVar175;
      fVar150 = (fVar174 - fVar138) + (auVar148._8_4_ - auVar148._0_4_);
      fVar161 = (fVar175 - fVar152) + (auVar148._12_4_ - auVar148._4_4_);
      auVar253._0_4_ = fVar223 * fVar161;
      auVar253._4_4_ = fVar223 * fVar161;
      auVar253._8_4_ = fVar258 * fVar161;
      auVar253._12_4_ = fVar258 * fVar161;
      fVar151 = auVar148._0_4_ * fVar150 + auVar148._4_4_ * fVar161;
      fVar72 = auVar148._8_4_ * fVar150 + auVar148._12_4_ * fVar161;
      fVar202 = fVar204 * fVar150 + fVar207 * fVar161;
      fVar203 = fVar208 * fVar150 + fVar209 * fVar161;
      fVar261 = fVar222 * fVar150 + auVar253._0_4_;
      auVar217._0_8_ = CONCAT44(fVar223 * fVar150 + auVar253._4_4_,fVar261);
      auVar217._8_4_ = fVar244 * fVar150 + auVar253._8_4_;
      auVar217._12_4_ = fVar258 * fVar150 + auVar253._12_4_;
      fVar137 = fVar150 * fVar138 + fVar161 * fVar152;
      fVar322 = fVar150 * fVar174 + fVar161 * fVar175;
      auVar29._4_8_ = auVar253._8_8_;
      auVar29._0_4_ = fVar207 * fVar150 + fVar207 * fVar161;
      auVar254._0_8_ = auVar29._0_8_ << 0x20;
      auVar254._8_4_ = fVar203;
      auVar254._12_4_ = fVar209 * fVar150 + fVar209 * fVar161;
      fVar136 = fVar202;
      if (fVar202 <= fVar151) {
        fVar136 = fVar151;
        fVar151 = fVar202;
      }
      auVar255._8_8_ = auVar254._8_8_;
      auVar255._0_8_ = auVar255._8_8_;
      auVar98._8_4_ = auVar217._8_4_;
      auVar98._0_8_ = auVar217._0_8_;
      auVar98._12_4_ = auVar217._12_4_;
      if (fVar137 <= fVar261) {
        auVar98._0_4_ = fVar137;
      }
      if (auVar98._0_4_ <= fVar151) {
        fVar151 = auVar98._0_4_;
      }
      auVar30._4_8_ = auVar98._8_8_;
      auVar30._0_4_ = fVar150 * fVar152 + fVar161 * fVar152;
      auVar99._0_8_ = auVar30._0_8_ << 0x20;
      auVar99._8_4_ = fVar322;
      auVar99._12_4_ = fVar150 * fVar175 + fVar161 * fVar175;
      if (fVar137 <= fVar261) {
        fVar137 = fVar261;
      }
      auVar100._8_8_ = auVar99._8_8_;
      auVar100._0_8_ = auVar100._8_8_;
      if (fVar137 <= fVar136) {
        fVar137 = fVar136;
      }
      if (fVar203 <= fVar72) {
        auVar255._0_4_ = fVar72;
        fVar72 = fVar203;
      }
      auVar130._8_4_ = auVar217._8_4_;
      auVar130._0_8_ = auVar217._8_8_;
      auVar130._12_4_ = auVar217._12_4_;
      if (fVar322 <= auVar217._8_4_) {
        auVar130._0_4_ = fVar322;
      }
      if (auVar130._0_4_ <= fVar72) {
        fVar72 = auVar130._0_4_;
      }
      if (fVar322 <= auVar217._8_4_) {
        auVar100._0_4_ = auVar217._8_4_;
      }
      if (auVar100._0_4_ <= auVar255._0_4_) {
        auVar100._0_4_ = auVar255._0_4_;
      }
      bVar64 = 3 < (uint)uVar63;
      uVar31 = (undefined3)(uVar67 >> 8);
      fVar136 = auVar100._0_4_;
      if ((0.0001 <= fVar151) || (fVar136 <= -0.0001)) break;
      goto LAB_00aee2ab;
    }
  } while( true );
  if ((fVar72 < 0.0001 && -0.0001 < fVar137) ||
     ((fVar151 < 0.0001 && -0.0001 < fVar137 ||
      (paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar31,bVar64),
      auVar95 = _local_418, fVar72 < 0.0001 && -0.0001 < fVar136)))) {
LAB_00aee2ab:
    _local_358 = auVar325;
    local_418 = (undefined1  [8])auVar233._8_8_;
    auVar95 = _local_418;
    bVar64 = bVar64 || fVar112 < 0.001;
    paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)CONCAT31(uVar31,bVar64);
    fVar161 = (float)(~-(uint)(fVar151 < 0.0) & 0x3f800000 | -(uint)(fVar151 < 0.0) & 0xbf800000);
    fVar202 = (float)(~-(uint)(fVar137 < 0.0) & 0x3f800000 | -(uint)(fVar137 < 0.0) & 0xbf800000);
    fVar150 = 0.0;
    if ((fVar161 == fVar202) && (!NAN(fVar161) && !NAN(fVar202))) {
      fVar150 = INFINITY;
    }
    fVar203 = 0.0;
    if ((fVar161 == fVar202) && (!NAN(fVar161) && !NAN(fVar202))) {
      fVar203 = -INFINITY;
    }
    fVar261 = (float)(~-(uint)(fVar72 < 0.0) & 0x3f800000 | -(uint)(fVar72 < 0.0) & 0xbf800000);
    if ((fVar161 != fVar261) || (fVar322 = fVar203, NAN(fVar161) || NAN(fVar261))) {
      if ((fVar72 != fVar151) || (NAN(fVar72) || NAN(fVar151))) {
        fVar72 = -fVar151 / (fVar72 - fVar151);
        fVar72 = (1.0 - fVar72) * 0.0 + fVar72;
        fVar322 = fVar72;
      }
      else {
        fVar72 = 0.0;
        if ((fVar151 != 0.0) || (fVar322 = 1.0, NAN(fVar151))) {
          fVar72 = INFINITY;
          fVar322 = -INFINITY;
        }
      }
      if (fVar72 <= fVar150) {
        fVar150 = fVar72;
      }
      if (fVar322 <= fVar203) {
        fVar322 = fVar203;
      }
    }
    fVar151 = *(float *)(&DAT_01f80eb4 + (ulong)(fVar136 < 0.0) * 4);
    if ((fVar202 != fVar151) || (fVar72 = fVar322, NAN(fVar202) || NAN(fVar151))) {
      if ((fVar136 != fVar137) || (NAN(fVar136) || NAN(fVar137))) {
        fVar161 = -fVar137 / (fVar136 - fVar137);
        fVar161 = (1.0 - fVar161) * 0.0 + fVar161;
        fVar72 = fVar161;
      }
      else {
        fVar161 = 0.0;
        if ((fVar137 != 0.0) || (fVar72 = 1.0, NAN(fVar137))) {
          fVar161 = INFINITY;
          fVar72 = -INFINITY;
        }
      }
      if (fVar161 <= fVar150) {
        fVar150 = fVar161;
      }
      if (fVar72 <= fVar322) {
        fVar72 = fVar322;
      }
    }
    if ((fVar261 != fVar151) || (NAN(fVar261) || NAN(fVar151))) {
      fVar150 = (float)(~-(uint)(fVar150 < 1.0) & 0x3f800000 |
                       (uint)fVar150 & -(uint)(fVar150 < 1.0));
      fVar72 = (float)(~-(uint)(fVar72 < 1.0) & (uint)fVar72 | -(uint)(fVar72 < 1.0) & 0x3f800000);
    }
    fStack_410 = auVar73._8_4_;
    fStack_40c = auVar73._12_4_;
    fVar150 = (float)(~-(uint)(fVar150 < 0.0) & (uint)fVar150);
    fVar151 = (float)(~-(uint)(fVar72 < 1.0) & 0x3f800000 | (uint)fVar72 & -(uint)(fVar72 < 1.0));
    auVar325 = _local_358;
    if (fVar150 <= fVar151) {
      fVar150 = fVar150 + -0.1;
      fVar151 = fVar151 + 0.1;
      uVar67 = -(uint)(fVar151 < 1.0);
      fVar150 = (float)(~-(uint)(fVar150 < 0.0) & (uint)fVar150);
      fVar72 = (float)(~uVar67 & 0x3f800000 | (uint)fVar151 & uVar67);
      fVar151 = 1.0 - fVar150;
      fVar228 = 1.0 - fVar150;
      fVar239 = 1.0 - fVar72;
      fVar241 = 1.0 - fVar72;
      fVar137 = auVar148._0_4_ * fVar151 + auVar148._8_4_ * fVar150;
      fVar161 = auVar148._4_4_ * fVar228 + auVar148._12_4_ * fVar150;
      fVar202 = auVar148._0_4_ * fVar239 + auVar148._8_4_ * fVar72;
      fVar203 = auVar148._4_4_ * fVar241 + auVar148._12_4_ * fVar72;
      fVar261 = fVar204 * fVar151 + fVar208 * fVar150;
      fVar322 = fVar207 * fVar228 + fVar209 * fVar150;
      fVar204 = fVar204 * fVar239 + fVar208 * fVar72;
      fVar207 = fVar207 * fVar241 + fVar209 * fVar72;
      fVar208 = fVar222 * fVar151 + fVar244 * fVar150;
      fVar209 = fVar223 * fVar228 + fVar258 * fVar150;
      fVar222 = fVar222 * fVar239 + fVar244 * fVar72;
      fVar223 = fVar223 * fVar241 + fVar258 * fVar72;
      fVar244 = fVar151 * fVar138 + fVar174 * fVar150;
      fVar258 = fVar228 * fVar152 + fVar175 * fVar150;
      fVar138 = fVar239 * fVar138 + fStack_410 * fVar72;
      fVar152 = fVar241 * fVar152 + fStack_40c * fVar72;
      fVar151 = fVar174 * (1.0 - fVar150) + fVar175 * fVar150;
      fVar72 = fVar174 * (1.0 - fVar72) + fVar175 * fVar72;
      fVar112 = 1.0 / fVar112;
      auVar131._0_4_ = fVar138 - fVar244;
      auVar131._4_4_ = fVar152 - fVar258;
      auVar131._8_4_ = fVar138 - fVar138;
      auVar131._12_4_ = fVar152 - fVar152;
      auVar159._0_8_ = CONCAT44(fVar223 - fVar209,fVar222 - fVar208);
      auVar159._8_4_ = fVar222 - fVar222;
      auVar159._12_4_ = fVar223 - fVar223;
      auVar197._0_4_ = fVar204 - fVar261;
      auVar197._4_4_ = fVar207 - fVar322;
      auVar197._8_4_ = fVar204 - fVar204;
      auVar197._12_4_ = fVar207 - fVar207;
      auVar256._0_8_ = CONCAT44((fVar322 - fVar161) * 3.0,(fVar261 - fVar137) * 3.0);
      auVar256._8_4_ = (fVar204 - fVar202) * 3.0;
      auVar256._12_4_ = (fVar207 - fVar203) * 3.0;
      auVar170._0_8_ = CONCAT44((fVar209 - fVar322) * 3.0,(fVar208 - fVar261) * 3.0);
      auVar170._8_4_ = (fVar222 - fVar204) * 3.0;
      auVar170._12_4_ = (fVar223 - fVar207) * 3.0;
      auVar296._0_4_ = (fVar244 - fVar208) * 3.0;
      auVar296._4_4_ = (fVar258 - fVar209) * 3.0;
      auVar296._8_4_ = (fVar138 - fVar222) * 3.0;
      auVar296._12_4_ = (fVar152 - fVar223) * 3.0;
      auVar218._8_4_ = auVar170._8_4_;
      auVar218._0_8_ = auVar170._0_8_;
      auVar218._12_4_ = auVar170._12_4_;
      auVar140 = minps(auVar218,auVar296);
      auVar73 = maxps(auVar170,auVar296);
      auVar274._8_4_ = auVar256._8_4_;
      auVar274._0_8_ = auVar256._0_8_;
      auVar274._12_4_ = auVar256._12_4_;
      auVar142 = minps(auVar274,auVar140);
      auVar126 = maxps(auVar256,auVar73);
      auVar32._4_8_ = auVar73._8_8_;
      auVar32._0_4_ = auVar142._4_4_;
      auVar171._0_8_ = auVar32._0_8_ << 0x20;
      auVar171._8_4_ = auVar142._8_4_;
      auVar171._12_4_ = auVar142._12_4_;
      auVar172._8_8_ = auVar142._8_8_;
      auVar172._0_8_ = auVar171._8_8_;
      auVar33._4_8_ = auVar140._8_8_;
      auVar33._0_4_ = auVar126._4_4_;
      auVar219._0_8_ = auVar33._0_8_ << 0x20;
      auVar219._8_4_ = auVar126._8_4_;
      auVar219._12_4_ = auVar126._12_4_;
      auVar220._8_8_ = auVar126._8_8_;
      auVar220._0_8_ = auVar219._8_8_;
      auVar140 = minps(auVar142,auVar172);
      auVar73 = maxps(auVar126,auVar220);
      fVar289 = auVar140._0_4_ * fVar112;
      fVar300 = auVar140._4_4_ * fVar112;
      fVar302 = auVar140._8_4_ * fVar112;
      fVar304 = auVar140._12_4_ * fVar112;
      fVar223 = fVar112 * auVar73._0_4_;
      fVar258 = fVar112 * auVar73._4_4_;
      fVar322 = fVar112 * auVar73._8_4_;
      fVar112 = fVar112 * auVar73._12_4_;
      fVar278 = 1.0 / (fVar72 - fVar151);
      auVar101._0_8_ = CONCAT44(fVar203 - fVar161,fVar202 - fVar137);
      auVar101._8_4_ = fVar202 - fVar202;
      auVar101._12_4_ = fVar203 - fVar203;
      auVar234._8_4_ = auVar101._8_4_;
      auVar234._0_8_ = auVar101._0_8_;
      auVar234._12_4_ = auVar101._12_4_;
      auVar126 = minps(auVar234,auVar197);
      auVar73 = maxps(auVar101,auVar197);
      auVar149._8_4_ = auVar159._8_4_;
      auVar149._0_8_ = auVar159._0_8_;
      auVar149._12_4_ = auVar159._12_4_;
      auVar140 = minps(auVar149,auVar131);
      auVar126 = minps(auVar126,auVar140);
      auVar140 = maxps(auVar159,auVar131);
      auVar73 = maxps(auVar73,auVar140);
      fVar241 = auVar126._0_4_ * fVar278;
      fVar266 = auVar126._4_4_ * fVar278;
      fVar281 = fVar278 * auVar73._0_4_;
      fVar278 = fVar278 * auVar73._4_4_;
      local_418._4_4_ = fVar151;
      local_418._0_4_ = fVar110;
      fStack_410 = fVar111;
      fStack_40c = fVar72;
      auVar221._4_4_ = fVar72;
      auVar221._0_4_ = fVar111;
      auVar221._8_4_ = fStack_3c0;
      auVar221._12_4_ = fStack_3bc;
      fVar203 = (fVar110 + fVar111) * 0.5;
      fVar204 = (fVar151 + fVar72) * 0.5;
      fVar207 = (fVar111 + fStack_3c0) * 0.0;
      fVar208 = (fVar72 + fStack_3bc) * 0.0;
      fVar137 = local_a8 * fVar203 + fVar162;
      fVar138 = fStack_a4 * fVar203 + fVar163;
      fVar150 = fStack_a0 * fVar203 + 0.0;
      fVar152 = fStack_9c * fVar203 + 0.0;
      fVar161 = local_b8 * fVar203 + (float)local_338._0_4_;
      fVar174 = fStack_b4 * fVar203 + (float)local_338._4_4_;
      fVar175 = fStack_b0 * fVar203 + fStack_330;
      fVar202 = fStack_ac * fVar203 + fStack_32c;
      fVar137 = (fVar161 - fVar137) * fVar203 + fVar137;
      fVar138 = (fVar174 - fVar138) * fVar203 + fVar138;
      fVar150 = (fVar175 - fVar150) * fVar203 + fVar150;
      fVar152 = (fVar202 - fVar152) * fVar203 + fVar152;
      fVar161 = (((local_c8 * fVar203 + (float)local_218) - fVar161) * fVar203 + fVar161) - fVar137;
      fVar174 = (((fStack_c4 * fVar203 + local_218._4_4_) - fVar174) * fVar203 + fVar174) - fVar138;
      fVar175 = (((fStack_c0 * fVar203 + fStack_210) - fVar175) * fVar203 + fVar175) - fVar150;
      fVar202 = (((fStack_bc * fVar203 + fStack_20c) - fVar202) * fVar203 + fVar202) - fVar152;
      fVar137 = fVar203 * fVar161 + fVar137;
      fVar138 = fVar203 * fVar174 + fVar138;
      fVar161 = fVar161 * 3.0;
      fVar174 = fVar174 * 3.0;
      fVar150 = (fVar203 * fVar175 + fVar150) - fVar137;
      fVar152 = (fVar203 * fVar202 + fVar152) - fVar138;
      fVar161 = (fVar175 * 3.0 - fVar161) * fVar204 + fVar161;
      fVar174 = (fVar202 * 3.0 - fVar174) * fVar204 + fVar174;
      auVar160._0_8_ = CONCAT44(fVar161,fVar150) ^ 0x80000000;
      auVar160._8_4_ = fVar161;
      auVar160._12_4_ = fVar161;
      fVar306 = fVar110 - fVar203;
      fVar316 = fVar151 - fVar204;
      fVar318 = fVar111 - fVar207;
      fVar320 = fVar72 - fVar208;
      fVar323 = fVar111 - fVar203;
      fVar327 = fVar72 - fVar204;
      fVar207 = fStack_3c0 - fVar207;
      fVar208 = fStack_3bc - fVar208;
      fVar137 = fVar150 * fVar204 + fVar137;
      fVar138 = fVar152 * fVar204 + fVar138;
      auVar173._0_8_ = CONCAT44(fVar174,fVar152) ^ 0x8000000000000000;
      auVar173._8_4_ = -fVar174;
      auVar173._12_4_ = -fVar174;
      auVar102._0_4_ = fVar152 * fVar161 - fVar174 * fVar150;
      auVar102._4_4_ = auVar102._0_4_;
      auVar102._8_4_ = auVar102._0_4_;
      auVar102._12_4_ = auVar102._0_4_;
      auVar140 = divps(auVar173,auVar102);
      auVar73 = divps(auVar160,auVar102);
      fVar209 = auVar140._0_4_;
      fVar222 = auVar140._4_4_;
      fVar175 = auVar73._0_4_;
      fVar202 = auVar73._4_4_;
      fVar203 = fVar203 - (fVar138 * fVar175 + fVar137 * fVar209);
      fVar161 = fVar204 - (fVar138 * fVar202 + fVar137 * fVar222);
      fVar174 = fVar204 - (fVar138 * auVar73._8_4_ + fVar137 * auVar140._8_4_);
      fVar204 = fVar204 - (fVar138 * auVar73._12_4_ + fVar137 * auVar140._12_4_);
      auVar132._0_8_ = CONCAT44(fVar222 * fVar241,fVar222 * fVar289);
      auVar132._8_4_ = fVar222 * fVar300;
      auVar132._12_4_ = fVar222 * fVar266;
      auVar103._0_4_ = fVar222 * fVar223;
      auVar103._4_4_ = fVar222 * fVar281;
      auVar103._8_4_ = fVar222 * fVar258;
      auVar103._12_4_ = fVar222 * fVar278;
      auVar333._8_4_ = auVar132._8_4_;
      auVar333._0_8_ = auVar132._0_8_;
      auVar333._12_4_ = auVar132._12_4_;
      auVar142 = minps(auVar333,auVar103);
      auVar73 = maxps(auVar103,auVar132);
      auVar198._0_8_ = CONCAT44(fVar202 * fVar266,fVar202 * fVar300);
      auVar198._8_4_ = fVar202 * fVar302;
      auVar198._12_4_ = fVar202 * fVar304;
      auVar133._0_4_ = fVar202 * fVar258;
      auVar133._4_4_ = fVar202 * fVar278;
      auVar133._8_4_ = fVar202 * fVar322;
      auVar133._12_4_ = fVar202 * fVar112;
      auVar275._8_4_ = auVar198._8_4_;
      auVar275._0_8_ = auVar198._0_8_;
      auVar275._12_4_ = auVar198._12_4_;
      auVar126 = minps(auVar275,auVar133);
      auVar140 = maxps(auVar133,auVar198);
      fVar137 = 0.0 - (auVar140._0_4_ + auVar73._0_4_);
      fVar138 = 1.0 - (auVar140._4_4_ + auVar73._4_4_);
      fVar150 = 0.0 - (auVar140._8_4_ + auVar73._8_4_);
      fVar152 = 0.0 - (auVar140._12_4_ + auVar73._12_4_);
      fVar244 = 0.0 - (auVar126._0_4_ + auVar142._0_4_);
      fVar261 = 1.0 - (auVar126._4_4_ + auVar142._4_4_);
      fVar228 = 0.0 - (auVar126._8_4_ + auVar142._8_4_);
      fVar239 = 0.0 - (auVar126._12_4_ + auVar142._12_4_);
      auVar134._0_8_ = CONCAT44(fVar316 * fVar138,fVar306 * fVar137);
      auVar134._8_4_ = fVar318 * fVar150;
      auVar134._12_4_ = fVar320 * fVar152;
      auVar297._0_8_ = CONCAT44(fVar241 * fVar209,fVar289 * fVar209);
      auVar297._8_4_ = fVar300 * fVar209;
      auVar297._12_4_ = fVar266 * fVar209;
      auVar199._0_4_ = fVar209 * fVar223;
      auVar199._4_4_ = fVar209 * fVar281;
      auVar199._8_4_ = fVar209 * fVar258;
      auVar199._12_4_ = fVar209 * fVar278;
      auVar276._8_4_ = auVar297._8_4_;
      auVar276._0_8_ = auVar297._0_8_;
      auVar276._12_4_ = auVar297._12_4_;
      auVar140 = minps(auVar276,auVar199);
      auVar73 = maxps(auVar199,auVar297);
      auVar235._0_8_ = CONCAT44(fVar266 * fVar175,fVar300 * fVar175);
      auVar235._8_4_ = fVar302 * fVar175;
      auVar235._12_4_ = fVar304 * fVar175;
      auVar298._0_4_ = fVar175 * fVar258;
      auVar298._4_4_ = fVar175 * fVar278;
      auVar298._8_4_ = fVar175 * fVar322;
      auVar298._12_4_ = fVar175 * fVar112;
      auVar332._8_4_ = auVar235._8_4_;
      auVar332._0_8_ = auVar235._0_8_;
      auVar332._12_4_ = auVar235._12_4_;
      auVar142 = minps(auVar332,auVar298);
      auVar277._0_4_ = fVar306 * fVar244;
      auVar277._4_4_ = fVar316 * fVar261;
      auVar277._8_4_ = fVar318 * fVar228;
      auVar277._12_4_ = fVar320 * fVar239;
      auVar104._0_8_ = CONCAT44(fVar138 * fVar327,fVar137 * fVar323);
      auVar104._8_4_ = fVar150 * fVar207;
      auVar104._12_4_ = fVar152 * fVar208;
      auVar206._0_4_ = fVar244 * fVar323;
      auVar206._4_4_ = fVar261 * fVar327;
      auVar206._8_4_ = fVar228 * fVar207;
      auVar206._12_4_ = fVar239 * fVar208;
      auVar126 = maxps(auVar298,auVar235);
      fVar112 = 1.0 - (auVar126._0_4_ + auVar73._0_4_);
      fVar137 = 0.0 - (auVar126._4_4_ + auVar73._4_4_);
      fVar138 = 0.0 - (auVar126._8_4_ + auVar73._8_4_);
      fVar150 = 0.0 - (auVar126._12_4_ + auVar73._12_4_);
      fVar152 = 1.0 - (auVar142._0_4_ + auVar140._0_4_);
      fVar223 = 0.0 - (auVar142._4_4_ + auVar140._4_4_);
      fVar244 = 0.0 - (auVar142._8_4_ + auVar140._8_4_);
      fVar258 = 0.0 - (auVar142._12_4_ + auVar140._12_4_);
      auVar236._0_8_ = CONCAT44(fVar316 * fVar137,fVar306 * fVar112);
      auVar236._8_4_ = fVar318 * fVar138;
      auVar236._12_4_ = fVar320 * fVar150;
      auVar315._0_4_ = fVar306 * fVar152;
      auVar315._4_4_ = fVar316 * fVar223;
      auVar315._8_4_ = fVar318 * fVar244;
      auVar315._12_4_ = fVar320 * fVar258;
      auVar200._0_8_ = CONCAT44(fVar137 * fVar327,fVar112 * fVar323);
      auVar200._8_4_ = fVar138 * fVar207;
      auVar200._12_4_ = fVar150 * fVar208;
      auVar257._0_4_ = fVar152 * fVar323;
      auVar257._4_4_ = fVar223 * fVar327;
      auVar257._8_4_ = fVar244 * fVar207;
      auVar257._12_4_ = fVar258 * fVar208;
      auVar299._8_4_ = auVar236._8_4_;
      auVar299._0_8_ = auVar236._0_8_;
      auVar299._12_4_ = auVar236._12_4_;
      auVar73 = minps(auVar299,auVar315);
      auVar326._8_4_ = auVar200._8_4_;
      auVar326._0_8_ = auVar200._0_8_;
      auVar326._12_4_ = auVar200._12_4_;
      auVar140 = minps(auVar326,auVar257);
      auVar252 = minps(auVar73,auVar140);
      auVar140 = maxps(auVar315,auVar236);
      auVar73 = maxps(auVar257,auVar200);
      auVar126 = maxps(auVar73,auVar140);
      auVar237._8_4_ = auVar134._8_4_;
      auVar237._0_8_ = auVar134._0_8_;
      auVar237._12_4_ = auVar134._12_4_;
      auVar140 = minps(auVar237,auVar277);
      auVar201._8_4_ = auVar104._8_4_;
      auVar201._0_8_ = auVar104._0_8_;
      auVar201._12_4_ = auVar104._12_4_;
      auVar73 = minps(auVar201,auVar206);
      auVar140 = minps(auVar140,auVar73);
      auVar142 = maxps(auVar277,auVar134);
      auVar73 = maxps(auVar206,auVar104);
      auVar73 = maxps(auVar73,auVar142);
      auVar238._0_4_ = auVar252._4_4_ + auVar252._0_4_ + fVar203;
      auVar238._4_4_ = auVar140._4_4_ + auVar140._0_4_ + fVar161;
      auVar238._8_4_ = auVar252._8_4_ + auVar252._4_4_ + fVar174;
      auVar238._12_4_ = auVar252._12_4_ + auVar140._4_4_ + fVar204;
      fVar112 = auVar126._4_4_ + auVar126._0_4_ + fVar203;
      fVar137 = auVar73._4_4_ + auVar73._0_4_ + fVar161;
      auVar105._4_4_ = fVar137;
      auVar105._0_4_ = fVar112;
      auVar140 = maxps(_local_418,auVar238);
      auVar105._8_4_ = auVar126._8_4_ + auVar126._4_4_ + fVar174;
      auVar105._12_4_ = auVar126._12_4_ + auVar73._4_4_ + fVar204;
      auVar73 = minps(auVar105,auVar221);
      iVar66 = -(uint)(auVar73._0_4_ < auVar140._0_4_);
      iVar68 = -(uint)(auVar73._4_4_ < auVar140._4_4_);
      auVar107._4_4_ = iVar68;
      auVar107._0_4_ = iVar66;
      auVar107._8_4_ = iVar68;
      auVar107._12_4_ = iVar68;
      auVar106._8_8_ = auVar107._8_8_;
      auVar106._4_4_ = iVar66;
      auVar106._0_4_ = iVar66;
      iVar66 = movmskpd((uint)(fVar136 < 0.0),auVar106);
      auVar325 = _DAT_01f7b6c0;
      auVar95 = _local_418;
      if (iVar66 == 0) {
        bVar56 = 0;
        if ((fVar110 < auVar238._0_4_) && (fVar112 < fVar111)) {
          bVar56 = -(fVar137 < fVar72) & fVar151 < auVar238._4_4_;
        }
        bVar56 = bVar64 | bVar56;
        uVar58 = (ulong)CONCAT31(uVar31,bVar56);
        if (bVar56 != 1) goto LAB_00aed8de;
        paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)&DAT_000000c8;
        do {
          fVar151 = 1.0 - fVar203;
          fVar112 = fVar203 * fVar203 * fVar203;
          fVar111 = fVar203 * fVar203 * 3.0 * fVar151;
          fVar72 = fVar151 * fVar151 * fVar151;
          fVar136 = fVar203 * 3.0 * fVar151 * fVar151;
          fVar110 = fVar72 * fVar162 +
                    fVar136 * (float)local_338._0_4_ +
                    fVar111 * (float)local_218 + fVar112 * (float)local_88._0_4_;
          fVar151 = fVar72 * fVar163 +
                    fVar136 * (float)local_338._4_4_ +
                    fVar111 * local_218._4_4_ + fVar112 * (float)local_88._4_4_;
          fVar110 = ((fVar72 * 0.0 +
                     fVar136 * fStack_330 + fVar111 * fStack_210 + fVar112 * fStack_80) - fVar110) *
                    fVar161 + fVar110;
          fVar151 = ((fVar72 * 0.0 +
                     fVar136 * fStack_32c + fVar111 * fStack_20c + fVar112 * fStack_7c) - fVar151) *
                    fVar161 + fVar151;
          fVar203 = fVar203 - (fVar151 * fVar175 + fVar110 * fVar209);
          fVar161 = fVar161 - (fVar151 * fVar202 + fVar110 * fVar222);
          fVar110 = (float)((uint)fVar110 & (uint)DAT_01f7b6c0);
          fVar151 = (float)((uint)fVar151 & DAT_01f7b6c0._4_4_);
          if (fVar151 <= fVar110) {
            fVar151 = fVar110;
          }
          if (fVar151 < local_98) {
            auVar325 = _DAT_01f7b6c0;
            if ((((fVar203 < 0.0) || (auVar325 = _DAT_01f7b6c0, 1.0 < fVar203)) ||
                (auVar325 = _DAT_01f7b6c0, fVar161 < 0.0)) ||
               (auVar325 = _DAT_01f7b6c0, 1.0 < fVar161)) break;
            fVar151 = (pre->ray_space).vx.field_0.m128[2];
            fVar72 = (pre->ray_space).vy.field_0.m128[2];
            fVar110 = (pre->ray_space).vz.field_0.m128[2];
            fVar111 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar112 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar136 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar175 = 1.0 - fVar161;
            fVar174 = 1.0 - fVar203;
            fVar137 = fVar174 * fVar174 * fVar174;
            fVar138 = fVar203 * 3.0 * fVar174 * fVar174;
            fVar152 = fVar203 * fVar203 * fVar203;
            fVar150 = fVar203 * fVar203 * 3.0 * fVar174;
            fVar151 = (((fStack_380 - fVar136) * fVar110 +
                       (fStack_384 - fVar112) * fVar72 + (local_388 - fVar111) * fVar151) * fVar175
                      + ((fStack_370 - fVar136) * fVar110 +
                        (fStack_374 - fVar112) * fVar72 + (local_378 - fVar111) * fVar151) * fVar161
                      ) * fVar137 +
                      (((fStack_390 - fVar136) * fVar110 +
                       (fStack_394 - fVar112) * fVar72 + (local_398 - fVar111) * fVar151) * fVar175
                      + ((fStack_360 - fVar136) * fVar110 +
                        (fStack_364 - fVar112) * fVar72 + (local_368 - fVar111) * fVar151) * fVar161
                      ) * fVar138 +
                      (((fStack_3b0 - fVar136) * fVar110 +
                       (fStack_3b4 - fVar112) * fVar72 + (local_3b8 - fVar111) * fVar151) * fVar175
                      + ((local_3dc.m128[3] - fVar136) * fVar110 +
                        (local_3dc.m128[2] - fVar112) * fVar72 +
                        (local_3dc.m128[1] - fVar111) * fVar151) * fVar161) * fVar150 +
                      (fVar175 * ((fStack_3a0 - fVar136) * fVar110 +
                                 (fStack_3a4 - fVar112) * fVar72 + (local_3a8 - fVar111) * fVar151)
                      + ((fStack_220 - fVar136) * fVar110 +
                        (fStack_224 - fVar112) * fVar72 + (local_228 - fVar111) * fVar151) * fVar161
                      ) * fVar152;
            auVar325 = _DAT_01f7b6c0;
            if (fVar151 < (ray->super_RayK<1>).org.field_0.m128[3]) break;
            fVar72 = (ray->super_RayK<1>).tfar;
            auVar325 = ZEXT416((uint)fVar72);
            if (fVar72 < fVar151) break;
            fVar136 = 1.0 - fVar161;
            fVar175 = 1.0 - fVar161;
            fVar202 = 1.0 - fVar161;
            fVar110 = local_398 * fVar136 + local_368 * fVar161;
            fVar111 = fStack_394 * fVar175 + fStack_364 * fVar161;
            fVar112 = fStack_390 * fVar202 + fStack_360 * fVar161;
            fVar204 = local_3b8 * fVar136 + local_3dc.m128[1] * fVar161;
            fVar208 = fStack_3b4 * fVar175 + local_3dc.m128[2] * fVar161;
            fVar222 = fStack_3b0 * fVar202 + local_3dc.m128[3] * fVar161;
            fVar207 = fVar204 - fVar110;
            fVar209 = fVar208 - fVar111;
            fVar223 = fVar222 - fVar112;
            fVar110 = (((fVar110 - (local_388 * fVar136 + local_378 * fVar161)) * fVar174 +
                       fVar203 * fVar207) * fVar174 +
                      (fVar207 * fVar174 +
                      ((fVar136 * local_3a8 + fVar161 * local_228) - fVar204) * fVar203) * fVar203)
                      * 3.0;
            fVar111 = (((fVar111 - (fStack_384 * fVar175 + fStack_374 * fVar161)) * fVar174 +
                       fVar203 * fVar209) * fVar174 +
                      (fVar209 * fVar174 +
                      ((fVar175 * fStack_3a4 + fVar161 * fStack_224) - fVar208) * fVar203) * fVar203
                      ) * 3.0;
            fVar112 = (((fVar112 - (fStack_380 * fVar202 + fStack_370 * fVar161)) * fVar174 +
                       fVar203 * fVar223) * fVar174 +
                      (fVar223 * fVar174 +
                      ((fVar202 * fStack_3a0 + fVar161 * fStack_220) - fVar222) * fVar203) * fVar203
                      ) * 3.0;
            pGVar19 = (context->scene->geometries).items[local_3e8].ptr;
            uVar67 = (ray->super_RayK<1>).mask;
            paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar67;
            if ((pGVar19->mask & uVar67) == 0) break;
            fVar174 = fVar137 * local_188 +
                      fVar138 * local_198 + fVar150 * local_1a8 + fVar152 * local_1b8;
            fVar175 = fVar137 * fStack_184 +
                      fVar138 * fStack_194 + fVar150 * fStack_1a4 + fVar152 * fStack_1b4;
            fVar137 = fVar137 * fStack_180 +
                      fVar138 * fStack_190 + fVar150 * fStack_1a0 + fVar152 * fStack_1b0;
            fVar136 = fVar175 * fVar110 - fVar111 * fVar174;
            uVar153 = CONCAT44(fVar174 * fVar112 - fVar110 * fVar137,
                               fVar137 * fVar111 - fVar112 * fVar175);
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              (ray->super_RayK<1>).tfar = fVar151;
              *(undefined8 *)&(ray->Ng).field_0 = uVar153;
              (ray->Ng).field_0.field_0.z = fVar136;
              ray->u = fVar203;
              ray->v = fVar161;
              ray->primID = (uint)local_340;
              ray->geomID = (uint)fVar176;
              ray->instID[0] = context->user->instID[0];
              uVar67 = context->user->instPrimID[0];
              ray->instPrimID[0] = uVar67;
              paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(ulong)uVar67;
              break;
            }
            local_1f8 = uVar153;
            local_1f0 = fVar136;
            local_1ec = fVar203;
            fStack_1e8 = fVar161;
            local_1e4 = (uint)local_340;
            local_1e0 = fVar176;
            local_1dc = context->user->instID[0];
            local_1d8 = context->user->instPrimID[0];
            (ray->super_RayK<1>).tfar = fVar151;
            local_3dc.m128[0] = -NAN;
            local_298.valid = (int *)&local_3dc;
            local_298.geometryUserPtr = pGVar19->userPtr;
            local_298.context = context->user;
            local_298.ray = (RTCRayN *)ray;
            local_298.hit = (RTCHitN *)&local_1f8;
            local_298.N = 1;
            if ((pGVar19->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
               (local_3c8 = lVar62, (*pGVar19->intersectionFilterN)(&local_298), lVar62 = local_3c8,
               *(float *)local_298.valid != 0.0)) {
              p_Var24 = context->args->filter;
              if ((p_Var24 == (RTCFilterFunctionN)0x0) ||
                 ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                    RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar19->field_8).field_0x2 & 0x40) == 0))
                  || ((*p_Var24)(&local_298), *(float *)local_298.valid != 0.0)))) {
                *(float *)((long)local_298.ray + 0x30) = *(float *)local_298.hit;
                *(float *)((long)local_298.ray + 0x34) = *(float *)(local_298.hit + 4);
                *(float *)((long)local_298.ray + 0x38) = *(float *)(local_298.hit + 8);
                *(float *)((long)local_298.ray + 0x3c) = *(float *)(local_298.hit + 0xc);
                *(float *)((long)local_298.ray + 0x40) = *(float *)(local_298.hit + 0x10);
                *(float *)((long)local_298.ray + 0x44) = *(float *)(local_298.hit + 0x14);
                *(float *)((long)local_298.ray + 0x48) = *(float *)(local_298.hit + 0x18);
                *(float *)((long)local_298.ray + 0x4c) = *(float *)(local_298.hit + 0x1c);
                *(float *)((long)local_298.ray + 0x50) = *(float *)(local_298.hit + 0x20);
                paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_298.ray;
                break;
              }
            }
            (ray->super_RayK<1>).tfar = fVar72;
            paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_298.valid;
            break;
          }
          paVar59 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)((long)paVar59 + -1);
          auVar325 = _DAT_01f7b6c0;
        } while (paVar59 != (anon_union_16_2_47237d3f_for_Vec3fx_0 *)0x0);
      }
    }
  }
  goto LAB_00aedf4b;
}

Assistant:

static __forceinline void intersect_n(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }